

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [12];
  float fVar73;
  float fVar74;
  float fVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [28];
  int iVar80;
  uint uVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  long lVar87;
  undefined4 uVar88;
  undefined8 unaff_R14;
  ulong uVar89;
  undefined8 uVar90;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar91 [16];
  float fVar110;
  float fVar113;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar111;
  float fVar114;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar95 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  vint4 ai;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 ai_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar188;
  float fVar193;
  float fVar195;
  undefined1 auVar189 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar190 [32];
  float fVar197;
  undefined1 auVar191 [32];
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar192 [32];
  float fVar202;
  float fVar209;
  float fVar210;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar211;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined4 uVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined4 local_960;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 (*local_788) [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [2] [32];
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar83 = (ulong)(byte)PVar6;
  auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar160 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar160 = vsubps_avx(auVar160,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar138 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar91._0_4_ = fVar138 * auVar160._0_4_;
  auVar91._4_4_ = fVar138 * auVar160._4_4_;
  auVar91._8_4_ = fVar138 * auVar160._8_4_;
  auVar91._12_4_ = fVar138 * auVar160._12_4_;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar175._0_4_ = fVar138 * auVar12._0_4_;
  auVar175._4_4_ = fVar138 * auVar12._4_4_;
  auVar175._8_4_ = fVar138 * auVar12._8_4_;
  auVar175._12_4_ = fVar138 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xc + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x12 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x13 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x14 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar232._4_4_ = auVar175._0_4_;
  auVar232._0_4_ = auVar175._0_4_;
  auVar232._8_4_ = auVar175._0_4_;
  auVar232._12_4_ = auVar175._0_4_;
  auVar139 = vshufps_avx(auVar175,auVar175,0x55);
  auVar92 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar138 = auVar92._0_4_;
  auVar218._0_4_ = fVar138 * auVar13._0_4_;
  fVar110 = auVar92._4_4_;
  auVar218._4_4_ = fVar110 * auVar13._4_4_;
  fVar111 = auVar92._8_4_;
  auVar218._8_4_ = fVar111 * auVar13._8_4_;
  fVar113 = auVar92._12_4_;
  auVar218._12_4_ = fVar113 * auVar13._12_4_;
  auVar203._0_4_ = auVar165._0_4_ * fVar138;
  auVar203._4_4_ = auVar165._4_4_ * fVar110;
  auVar203._8_4_ = auVar165._8_4_ * fVar111;
  auVar203._12_4_ = auVar165._12_4_ * fVar113;
  auVar189._0_4_ = auVar119._0_4_ * fVar138;
  auVar189._4_4_ = auVar119._4_4_ * fVar110;
  auVar189._8_4_ = auVar119._8_4_ * fVar111;
  auVar189._12_4_ = auVar119._12_4_ * fVar113;
  auVar92 = vfmadd231ps_fma(auVar218,auVar139,auVar12);
  auVar120 = vfmadd231ps_fma(auVar203,auVar139,auVar15);
  auVar139 = vfmadd231ps_fma(auVar189,auVar93,auVar139);
  auVar151 = vfmadd231ps_fma(auVar92,auVar232,auVar160);
  auVar120 = vfmadd231ps_fma(auVar120,auVar232,auVar14);
  auVar156 = vfmadd231ps_fma(auVar139,auVar94,auVar232);
  auVar233._4_4_ = auVar91._0_4_;
  auVar233._0_4_ = auVar91._0_4_;
  auVar233._8_4_ = auVar91._0_4_;
  auVar233._12_4_ = auVar91._0_4_;
  auVar139 = vshufps_avx(auVar91,auVar91,0x55);
  auVar92 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar138 = auVar92._0_4_;
  auVar176._0_4_ = fVar138 * auVar13._0_4_;
  fVar110 = auVar92._4_4_;
  auVar176._4_4_ = fVar110 * auVar13._4_4_;
  fVar111 = auVar92._8_4_;
  auVar176._8_4_ = fVar111 * auVar13._8_4_;
  fVar113 = auVar92._12_4_;
  auVar176._12_4_ = fVar113 * auVar13._12_4_;
  auVar118._0_4_ = auVar165._0_4_ * fVar138;
  auVar118._4_4_ = auVar165._4_4_ * fVar110;
  auVar118._8_4_ = auVar165._8_4_ * fVar111;
  auVar118._12_4_ = auVar165._12_4_ * fVar113;
  auVar92._0_4_ = auVar119._0_4_ * fVar138;
  auVar92._4_4_ = auVar119._4_4_ * fVar110;
  auVar92._8_4_ = auVar119._8_4_ * fVar111;
  auVar92._12_4_ = auVar119._12_4_ * fVar113;
  auVar12 = vfmadd231ps_fma(auVar176,auVar139,auVar12);
  auVar13 = vfmadd231ps_fma(auVar118,auVar139,auVar15);
  auVar15 = vfmadd231ps_fma(auVar92,auVar139,auVar93);
  auVar93 = vfmadd231ps_fma(auVar12,auVar233,auVar160);
  auVar119 = vfmadd231ps_fma(auVar13,auVar233,auVar14);
  local_3d0._8_4_ = 0x7fffffff;
  local_3d0._0_8_ = 0x7fffffff7fffffff;
  local_3d0._12_4_ = 0x7fffffff;
  auVar160 = vandps_avx(auVar151,local_3d0);
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar160 = vcmpps_avx(auVar160,auVar184,1);
  auVar12 = vblendvps_avx(auVar151,auVar184,auVar160);
  auVar160 = vandps_avx(auVar120,local_3d0);
  auVar160 = vcmpps_avx(auVar160,auVar184,1);
  auVar13 = vblendvps_avx(auVar120,auVar184,auVar160);
  auVar160 = vandps_avx(auVar156,local_3d0);
  auVar160 = vcmpps_avx(auVar160,auVar184,1);
  auVar160 = vblendvps_avx(auVar156,auVar184,auVar160);
  auVar139 = vfmadd231ps_fma(auVar15,auVar233,auVar94);
  auVar14 = vrcpps_avx(auVar12);
  auVar185._8_4_ = 0x3f800000;
  auVar185._0_8_ = 0x3f8000003f800000;
  auVar185._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar185);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar185);
  auVar165 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar160);
  auVar160 = vfnmadd213ps_fma(auVar160,auVar12,auVar185);
  auVar94 = vfmadd132ps_fma(auVar160,auVar12,auVar12);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar160 = vpmovsxwd_avx(auVar160);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar160 = vsubps_avx(auVar160,auVar93);
  auVar156._0_4_ = auVar14._0_4_ * auVar160._0_4_;
  auVar156._4_4_ = auVar14._4_4_ * auVar160._4_4_;
  auVar156._8_4_ = auVar14._8_4_ * auVar160._8_4_;
  auVar156._12_4_ = auVar14._12_4_ * auVar160._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar160 = vpmovsxwd_avx(auVar12);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar160 = vsubps_avx(auVar160,auVar93);
  auVar169._0_4_ = auVar14._0_4_ * auVar160._0_4_;
  auVar169._4_4_ = auVar14._4_4_ * auVar160._4_4_;
  auVar169._8_4_ = auVar14._8_4_ * auVar160._8_4_;
  auVar169._12_4_ = auVar14._12_4_ * auVar160._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar83 * 0xe + 6);
  auVar160 = vpmovsxwd_avx(auVar13);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar160 = vsubps_avx(auVar160,auVar119);
  auVar177._0_4_ = auVar165._0_4_ * auVar160._0_4_;
  auVar177._4_4_ = auVar165._4_4_ * auVar160._4_4_;
  auVar177._8_4_ = auVar165._8_4_ * auVar160._8_4_;
  auVar177._12_4_ = auVar165._12_4_ * auVar160._12_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar6;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar160 = vpmovsxwd_avx(auVar14);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar12 = vsubps_avx(auVar160,auVar119);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar83 * 0x15 + 6);
  auVar160 = vpmovsxwd_avx(auVar15);
  auVar119._0_4_ = auVar165._0_4_ * auVar12._0_4_;
  auVar119._4_4_ = auVar165._4_4_ * auVar12._4_4_;
  auVar119._8_4_ = auVar165._8_4_ * auVar12._8_4_;
  auVar119._12_4_ = auVar165._12_4_ * auVar12._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar160 = vsubps_avx(auVar160,auVar139);
  auVar151._0_4_ = auVar94._0_4_ * auVar160._0_4_;
  auVar151._4_4_ = auVar94._4_4_ * auVar160._4_4_;
  auVar151._8_4_ = auVar94._8_4_ * auVar160._8_4_;
  auVar151._12_4_ = auVar94._12_4_ * auVar160._12_4_;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar160 = vpmovsxwd_avx(auVar165);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar160 = vsubps_avx(auVar160,auVar139);
  auVar93._0_4_ = auVar94._0_4_ * auVar160._0_4_;
  auVar93._4_4_ = auVar94._4_4_ * auVar160._4_4_;
  auVar93._8_4_ = auVar94._8_4_ * auVar160._8_4_;
  auVar93._12_4_ = auVar94._12_4_ * auVar160._12_4_;
  auVar160 = vpminsd_avx(auVar156,auVar169);
  auVar12 = vpminsd_avx(auVar177,auVar119);
  auVar160 = vmaxps_avx(auVar160,auVar12);
  auVar12 = vpminsd_avx(auVar151,auVar93);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar204._4_4_ = uVar88;
  auVar204._0_4_ = uVar88;
  auVar204._8_4_ = uVar88;
  auVar204._12_4_ = uVar88;
  auVar12 = vmaxps_avx(auVar12,auVar204);
  auVar160 = vmaxps_avx(auVar160,auVar12);
  local_3e0._0_4_ = auVar160._0_4_ * 0.99999964;
  local_3e0._4_4_ = auVar160._4_4_ * 0.99999964;
  local_3e0._8_4_ = auVar160._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar160._12_4_ * 0.99999964;
  auVar160 = vpmaxsd_avx(auVar156,auVar169);
  auVar12 = vpmaxsd_avx(auVar177,auVar119);
  auVar160 = vminps_avx(auVar160,auVar12);
  auVar12 = vpmaxsd_avx(auVar151,auVar93);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar139._4_4_ = uVar88;
  auVar139._0_4_ = uVar88;
  auVar139._8_4_ = uVar88;
  auVar139._12_4_ = uVar88;
  auVar12 = vminps_avx(auVar12,auVar139);
  auVar160 = vminps_avx(auVar160,auVar12);
  auVar94._0_4_ = auVar160._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar160._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar160._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar160._12_4_ * 1.0000004;
  auVar120[4] = PVar6;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar6;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar6;
  auVar120._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar120,_DAT_01f4ad30);
  auVar160 = vcmpps_avx(local_3e0,auVar94,2);
  auVar160 = vandps_avx(auVar160,auVar12);
  uVar88 = vmovmskps_avx(auVar160);
  uVar89 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar88);
  local_6a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_6a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_6a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_6a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_788 = (undefined1 (*) [32])&local_140;
  iVar80 = 1 << ((uint)k & 0x1f);
  auVar98._4_4_ = iVar80;
  auVar98._0_4_ = iVar80;
  auVar98._8_4_ = iVar80;
  auVar98._12_4_ = iVar80;
  auVar98._16_4_ = iVar80;
  auVar98._20_4_ = iVar80;
  auVar98._24_4_ = iVar80;
  auVar98._28_4_ = iVar80;
  auVar121 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar98 = vpand_avx2(auVar98,auVar121);
  local_280 = vpcmpeqd_avx2(auVar98,auVar121);
  do {
    if (uVar89 == 0) {
      return;
    }
    lVar86 = 0;
    for (uVar84 = uVar89; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      lVar86 = lVar86 + 1;
    }
    uVar89 = uVar89 - 1 & uVar89;
    uVar81 = *(uint *)(prim + lVar86 * 4 + 6);
    uVar84 = (ulong)(uint)((int)lVar86 << 6);
    uVar7 = *(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
    pPVar1 = prim + uVar84 + uVar83 * 0x19 + 0x16;
    uVar76 = *(undefined8 *)pPVar1;
    uVar77 = *(undefined8 *)(pPVar1 + 8);
    auVar13 = *(undefined1 (*) [16])pPVar1;
    auVar12 = *(undefined1 (*) [16])pPVar1;
    auVar160 = *(undefined1 (*) [16])pPVar1;
    if (uVar89 != 0) {
      uVar85 = uVar89 - 1 & uVar89;
      for (uVar19 = uVar89; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
      }
      if (uVar85 != 0) {
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar14 = *(undefined1 (*) [16])(prim + uVar84 + uVar83 * 0x19 + 0x26);
    auVar15 = *(undefined1 (*) [16])(prim + uVar84 + uVar83 * 0x19 + 0x36);
    auVar165 = *(undefined1 (*) [16])(prim + uVar84 + uVar83 * 0x19 + 0x46);
    iVar80 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar139 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar93 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar139);
    uVar88 = auVar93._0_4_;
    auVar157._4_4_ = uVar88;
    auVar157._0_4_ = uVar88;
    auVar157._8_4_ = uVar88;
    auVar157._12_4_ = uVar88;
    auVar94 = vshufps_avx(auVar93,auVar93,0x55);
    auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar138 = pre->ray_space[k].vz.field_0.m128[0];
    fVar110 = pre->ray_space[k].vz.field_0.m128[1];
    fVar111 = pre->ray_space[k].vz.field_0.m128[2];
    fVar113 = pre->ray_space[k].vz.field_0.m128[3];
    auVar178._0_4_ = fVar138 * auVar93._0_4_;
    auVar178._4_4_ = fVar110 * auVar93._4_4_;
    auVar178._8_4_ = fVar111 * auVar93._8_4_;
    auVar178._12_4_ = fVar113 * auVar93._12_4_;
    auVar94 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar94);
    auVar120 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar157);
    auVar94 = vblendps_avx(auVar120,*(undefined1 (*) [16])pPVar1,8);
    auVar119 = vsubps_avx(auVar14,auVar139);
    uVar88 = auVar119._0_4_;
    auVar179._4_4_ = uVar88;
    auVar179._0_4_ = uVar88;
    auVar179._8_4_ = uVar88;
    auVar179._12_4_ = uVar88;
    auVar93 = vshufps_avx(auVar119,auVar119,0x55);
    auVar119 = vshufps_avx(auVar119,auVar119,0xaa);
    auVar219._0_4_ = fVar138 * auVar119._0_4_;
    auVar219._4_4_ = fVar110 * auVar119._4_4_;
    auVar219._8_4_ = fVar111 * auVar119._8_4_;
    auVar219._12_4_ = fVar113 * auVar119._12_4_;
    auVar93 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar93);
    auVar151 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar179);
    auVar93 = vblendps_avx(auVar151,auVar14,8);
    auVar92 = vsubps_avx(auVar15,auVar139);
    uVar88 = auVar92._0_4_;
    auVar186._4_4_ = uVar88;
    auVar186._0_4_ = uVar88;
    auVar186._8_4_ = uVar88;
    auVar186._12_4_ = uVar88;
    auVar119 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar225._0_4_ = fVar138 * auVar92._0_4_;
    auVar225._4_4_ = fVar110 * auVar92._4_4_;
    auVar225._8_4_ = fVar111 * auVar92._8_4_;
    auVar225._12_4_ = fVar113 * auVar92._12_4_;
    auVar119 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar119);
    auVar156 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar4,auVar186);
    auVar119 = vblendps_avx(auVar156,auVar15,8);
    auVar92 = vsubps_avx(auVar165,auVar139);
    uVar88 = auVar92._0_4_;
    auVar187._4_4_ = uVar88;
    auVar187._0_4_ = uVar88;
    auVar187._8_4_ = uVar88;
    auVar187._12_4_ = uVar88;
    auVar139 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar226._0_4_ = fVar138 * auVar92._0_4_;
    auVar226._4_4_ = fVar110 * auVar92._4_4_;
    auVar226._8_4_ = fVar111 * auVar92._8_4_;
    auVar226._12_4_ = fVar113 * auVar92._12_4_;
    auVar139 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar139);
    auVar91 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar4,auVar187);
    auVar139 = vblendps_avx(auVar91,auVar165,8);
    auVar94 = vandps_avx(auVar94,local_3d0);
    auVar93 = vandps_avx(auVar93,local_3d0);
    auVar92 = vmaxps_avx(auVar94,auVar93);
    auVar94 = vandps_avx(auVar119,local_3d0);
    auVar93 = vandps_avx(auVar139,local_3d0);
    auVar94 = vmaxps_avx(auVar94,auVar93);
    auVar94 = vmaxps_avx(auVar92,auVar94);
    auVar93 = vmovshdup_avx(auVar94);
    auVar93 = vmaxss_avx(auVar93,auVar94);
    auVar94 = vshufpd_avx(auVar94,auVar94,1);
    auVar94 = vmaxss_avx(auVar94,auVar93);
    lVar86 = (long)iVar80 * 0x44;
    auVar93 = vmovshdup_avx(auVar120);
    uVar90 = auVar93._0_8_;
    local_600._8_8_ = uVar90;
    local_600._0_8_ = uVar90;
    local_600._16_8_ = uVar90;
    local_600._24_8_ = uVar90;
    auVar93 = vmovshdup_avx(auVar151);
    uVar90 = auVar93._0_8_;
    local_580._8_8_ = uVar90;
    local_580._0_8_ = uVar90;
    local_580._16_8_ = uVar90;
    local_580._24_8_ = uVar90;
    auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 + 0x908);
    uVar224 = auVar156._0_4_;
    local_6e0._4_4_ = uVar224;
    local_6e0._0_4_ = uVar224;
    local_6e0._8_4_ = uVar224;
    local_6e0._12_4_ = uVar224;
    local_6e0._16_4_ = uVar224;
    local_6e0._20_4_ = uVar224;
    local_6e0._24_4_ = uVar224;
    local_6e0._28_4_ = uVar224;
    auVar93 = vmovshdup_avx(auVar156);
    uVar90 = auVar93._0_8_;
    local_620._8_8_ = uVar90;
    local_620._0_8_ = uVar90;
    local_620._16_8_ = uVar90;
    local_620._24_8_ = uVar90;
    pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar86 + 0xd8c);
    fVar73 = *(float *)*pauVar2;
    fVar74 = *(float *)(bspline_basis0 + lVar86 + 0xd90);
    fVar75 = *(float *)(bspline_basis0 + lVar86 + 0xd94);
    fVar112 = *(float *)(bspline_basis0 + lVar86 + 0xd98);
    fVar114 = *(float *)(bspline_basis0 + lVar86 + 0xd9c);
    fVar115 = *(float *)(bspline_basis0 + lVar86 + 0xda0);
    fVar116 = *(float *)(bspline_basis0 + lVar86 + 0xda4);
    auVar79 = *(undefined1 (*) [28])*pauVar2;
    local_500 = auVar91._0_4_;
    auVar93 = vmovshdup_avx(auVar91);
    local_720 = auVar93._0_8_;
    auVar121._0_4_ = local_500 * fVar73;
    auVar121._4_4_ = local_500 * fVar74;
    auVar121._8_4_ = local_500 * fVar75;
    auVar121._12_4_ = local_500 * fVar112;
    auVar121._16_4_ = local_500 * fVar114;
    auVar121._20_4_ = local_500 * fVar115;
    auVar121._24_4_ = local_500 * fVar116;
    auVar121._28_4_ = 0;
    auVar119 = vfmadd231ps_fma(auVar121,auVar98,local_6e0);
    fVar138 = auVar93._0_4_;
    auVar174._0_4_ = fVar73 * fVar138;
    fVar111 = auVar93._4_4_;
    auVar174._4_4_ = fVar74 * fVar111;
    auVar174._8_4_ = fVar75 * fVar138;
    auVar174._12_4_ = fVar112 * fVar111;
    auVar174._16_4_ = fVar114 * fVar138;
    auVar174._20_4_ = fVar115 * fVar111;
    auVar174._24_4_ = fVar116 * fVar138;
    auVar174._28_4_ = 0;
    auVar93 = vfmadd231ps_fma(auVar174,auVar98,local_620);
    auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 + 0x484);
    uVar88 = auVar151._0_4_;
    auVar190._4_4_ = uVar88;
    auVar190._0_4_ = uVar88;
    auVar190._8_4_ = uVar88;
    auVar190._12_4_ = uVar88;
    auVar190._16_4_ = uVar88;
    auVar190._20_4_ = uVar88;
    auVar190._24_4_ = uVar88;
    auVar190._28_4_ = uVar88;
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,auVar190);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar121,local_580);
    auVar174 = *(undefined1 (*) [32])(bspline_basis0 + lVar86);
    local_960 = auVar120._0_4_;
    auVar152._4_4_ = local_960;
    auVar152._0_4_ = local_960;
    auVar152._8_4_ = local_960;
    auVar152._12_4_ = local_960;
    auVar152._16_4_ = local_960;
    auVar152._20_4_ = local_960;
    auVar152._24_4_ = local_960;
    auVar152._28_4_ = local_960;
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar174,auVar152);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar174,local_600);
    auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 + 0x908);
    fVar117 = *(float *)(bspline_basis1 + lVar86 + 0xd8c);
    fVar194 = *(float *)(bspline_basis1 + lVar86 + 0xd90);
    fVar196 = *(float *)(bspline_basis1 + lVar86 + 0xd94);
    fVar198 = *(float *)(bspline_basis1 + lVar86 + 0xd98);
    fVar213 = *(float *)(bspline_basis1 + lVar86 + 0xd9c);
    fVar215 = *(float *)(bspline_basis1 + lVar86 + 0xda0);
    fVar217 = *(float *)(bspline_basis1 + lVar86 + 0xda4);
    auVar99._0_4_ = local_500 * fVar117;
    auVar99._4_4_ = local_500 * fVar194;
    auVar99._8_4_ = local_500 * fVar196;
    auVar99._12_4_ = local_500 * fVar198;
    auVar99._16_4_ = local_500 * fVar213;
    auVar99._20_4_ = local_500 * fVar215;
    auVar99._24_4_ = local_500 * fVar217;
    auVar99._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar99,auVar106,local_6e0);
    auVar107._4_4_ = fVar194 * fVar111;
    auVar107._0_4_ = fVar117 * fVar138;
    auVar107._8_4_ = fVar196 * fVar138;
    auVar107._12_4_ = fVar198 * fVar111;
    auVar107._16_4_ = fVar213 * fVar138;
    auVar107._20_4_ = fVar215 * fVar111;
    auVar107._24_4_ = fVar217 * fVar138;
    auVar107._28_4_ = uVar224;
    auVar92 = vfmadd231ps_fma(auVar107,auVar106,local_620);
    auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 + 0x484);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar107,auVar190);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar107,local_580);
    auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar86);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar99,auVar152);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar99,local_600);
    local_400 = ZEXT1632(auVar139);
    auVar122 = ZEXT1632(auVar119);
    local_520 = vsubps_avx(local_400,auVar122);
    local_420 = ZEXT1632(auVar92);
    local_440 = ZEXT1632(auVar93);
    local_460 = vsubps_avx(local_420,local_440);
    auVar100._0_4_ = auVar93._0_4_ * local_520._0_4_;
    auVar100._4_4_ = auVar93._4_4_ * local_520._4_4_;
    auVar100._8_4_ = auVar93._8_4_ * local_520._8_4_;
    auVar100._12_4_ = auVar93._12_4_ * local_520._12_4_;
    auVar100._16_4_ = local_520._16_4_ * 0.0;
    auVar100._20_4_ = local_520._20_4_ * 0.0;
    auVar100._24_4_ = local_520._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    fVar188 = local_460._0_4_;
    auVar123._0_4_ = fVar188 * auVar119._0_4_;
    fVar193 = local_460._4_4_;
    auVar123._4_4_ = fVar193 * auVar119._4_4_;
    fVar195 = local_460._8_4_;
    auVar123._8_4_ = fVar195 * auVar119._8_4_;
    fVar197 = local_460._12_4_;
    auVar123._12_4_ = fVar197 * auVar119._12_4_;
    fVar199 = local_460._16_4_;
    auVar123._16_4_ = fVar199 * 0.0;
    fVar200 = local_460._20_4_;
    auVar123._20_4_ = fVar200 * 0.0;
    fVar201 = local_460._24_4_;
    auVar123._24_4_ = fVar201 * 0.0;
    auVar123._28_4_ = 0;
    auVar100 = vsubps_avx(auVar100,auVar123);
    auVar93 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar90 = auVar93._0_8_;
    local_80._8_8_ = uVar90;
    local_80._0_8_ = uVar90;
    local_80._16_8_ = uVar90;
    local_80._24_8_ = uVar90;
    auVar119 = vpermilps_avx(auVar14,0xff);
    uVar90 = auVar119._0_8_;
    local_a0._8_8_ = uVar90;
    local_a0._0_8_ = uVar90;
    local_a0._16_8_ = uVar90;
    local_a0._24_8_ = uVar90;
    auVar119 = vpermilps_avx(auVar15,0xff);
    uVar90 = auVar119._0_8_;
    local_c0._8_8_ = uVar90;
    local_c0._0_8_ = uVar90;
    local_c0._16_8_ = uVar90;
    local_c0._24_8_ = uVar90;
    auVar119 = vpermilps_avx(auVar165,0xff);
    local_e0 = auVar119._0_8_;
    fVar110 = auVar119._0_4_;
    fVar113 = auVar119._4_4_;
    auVar170._4_4_ = fVar74 * fVar113;
    auVar170._0_4_ = fVar73 * fVar110;
    auVar170._8_4_ = fVar75 * fVar110;
    auVar170._12_4_ = fVar112 * fVar113;
    auVar170._16_4_ = fVar114 * fVar110;
    auVar170._20_4_ = fVar115 * fVar113;
    auVar170._24_4_ = fVar116 * fVar110;
    auVar170._28_4_ = local_960;
    auVar119 = vfmadd231ps_fma(auVar170,local_c0,auVar98);
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,local_a0);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar174,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar17._4_4_ = fVar194 * fVar113;
    auVar17._0_4_ = fVar117 * fVar110;
    auVar17._8_4_ = fVar196 * fVar110;
    auVar17._12_4_ = fVar198 * fVar113;
    auVar17._16_4_ = fVar213 * fVar110;
    auVar17._20_4_ = fVar215 * fVar113;
    auVar17._24_4_ = fVar217 * fVar110;
    auVar17._28_4_ = auVar174._28_4_;
    auVar119 = vfmadd231ps_fma(auVar17,auVar106,local_c0);
    auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar107,local_a0);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar99,local_80);
    auVar129._4_4_ = fVar193 * fVar193;
    auVar129._0_4_ = fVar188 * fVar188;
    auVar129._8_4_ = fVar195 * fVar195;
    auVar129._12_4_ = fVar197 * fVar197;
    auVar129._16_4_ = fVar199 * fVar199;
    auVar129._20_4_ = fVar200 * fVar200;
    auVar129._24_4_ = fVar201 * fVar201;
    auVar129._28_4_ = auVar93._4_4_;
    auVar93 = vfmadd231ps_fma(auVar129,local_520,local_520);
    auVar170 = vmaxps_avx(ZEXT1632(auVar139),ZEXT1632(auVar92));
    auVar182._4_4_ = auVar170._4_4_ * auVar170._4_4_ * auVar93._4_4_;
    auVar182._0_4_ = auVar170._0_4_ * auVar170._0_4_ * auVar93._0_4_;
    auVar182._8_4_ = auVar170._8_4_ * auVar170._8_4_ * auVar93._8_4_;
    auVar182._12_4_ = auVar170._12_4_ * auVar170._12_4_ * auVar93._12_4_;
    auVar182._16_4_ = auVar170._16_4_ * auVar170._16_4_ * 0.0;
    auVar182._20_4_ = auVar170._20_4_ * auVar170._20_4_ * 0.0;
    auVar182._24_4_ = auVar170._24_4_ * auVar170._24_4_ * 0.0;
    auVar182._28_4_ = auVar170._28_4_;
    auVar222._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar222._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar222._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar222._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar222._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar222._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar222._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar222._28_4_ = auVar100._28_4_;
    local_540._0_4_ = (undefined4)iVar80;
    register0x00001504 = auVar91._4_12_;
    auVar170 = vcmpps_avx(auVar222,auVar182,2);
    fVar110 = auVar94._0_4_ * 4.7683716e-07;
    auVar101._4_4_ = local_540._0_4_;
    auVar101._0_4_ = local_540._0_4_;
    auVar101._8_4_ = local_540._0_4_;
    auVar101._12_4_ = local_540._0_4_;
    auVar101._16_4_ = local_540._0_4_;
    auVar101._20_4_ = local_540._0_4_;
    auVar101._24_4_ = local_540._0_4_;
    auVar101._28_4_ = local_540._0_4_;
    auVar100 = vcmpps_avx(_DAT_01f7b060,auVar101,1);
    auVar93 = vpermilps_avx(auVar120,0xaa);
    uVar90 = auVar93._0_8_;
    local_760._8_8_ = uVar90;
    local_760._0_8_ = uVar90;
    local_760._16_8_ = uVar90;
    local_760._24_8_ = uVar90;
    auVar231 = ZEXT3264(local_760);
    auVar94 = vpermilps_avx(auVar151,0xaa);
    uVar90 = auVar94._0_8_;
    local_240._8_8_ = uVar90;
    local_240._0_8_ = uVar90;
    local_240._16_8_ = uVar90;
    local_240._24_8_ = uVar90;
    auVar119 = vpermilps_avx(auVar156,0xaa);
    uVar90 = auVar119._0_8_;
    auVar191._8_8_ = uVar90;
    auVar191._0_8_ = uVar90;
    auVar191._16_8_ = uVar90;
    auVar191._24_8_ = uVar90;
    auVar94 = vshufps_avx(auVar91,auVar91,0xaa);
    uVar90 = auVar94._0_8_;
    register0x00001508 = uVar90;
    local_7e0 = uVar90;
    register0x00001510 = uVar90;
    register0x00001518 = uVar90;
    auVar229 = ZEXT3264(_local_7e0);
    auVar17 = auVar100 & auVar170;
    uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_640._0_16_ = ZEXT416(uVar7);
    local_560 = ZEXT416(uVar81);
    local_870 = auVar14._0_8_;
    uStack_868 = auVar14._8_8_;
    local_880 = auVar15._0_8_;
    uStack_878 = auVar15._8_8_;
    local_890._0_4_ = auVar165._0_4_;
    fVar113 = (float)local_890;
    local_890._4_4_ = auVar165._4_4_;
    fVar73 = local_890._4_4_;
    uStack_888._0_4_ = auVar165._8_4_;
    fVar74 = (float)uStack_888;
    uStack_888._4_4_ = auVar165._12_4_;
    fVar75 = uStack_888._4_4_;
    local_890 = auVar165._0_8_;
    uStack_888 = auVar165._8_8_;
    uStack_718 = local_720;
    uStack_710 = local_720;
    uStack_708 = local_720;
    fStack_4fc = local_500;
    fStack_4f8 = local_500;
    fStack_4f4 = local_500;
    fStack_4f0 = local_500;
    fStack_4ec = local_500;
    fStack_4e8 = local_500;
    fStack_4e4 = local_500;
    local_560._0_4_ = uVar81;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0x7f,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar17 >> 0xbf,0) == '\0') &&
        (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f]) {
      auVar137 = ZEXT3264(local_780);
      auVar155 = ZEXT3264(local_6e0);
    }
    else {
      local_660 = SUB84(pGVar9,0);
      uStack_65c = (undefined4)((ulong)pGVar9 >> 0x20);
      _local_4a0 = vandps_avx(auVar170,auVar100);
      fVar188 = auVar94._0_4_;
      fVar193 = auVar94._4_4_;
      auVar16._4_4_ = fVar193 * fVar194;
      auVar16._0_4_ = fVar188 * fVar117;
      auVar16._8_4_ = fVar188 * fVar196;
      auVar16._12_4_ = fVar193 * fVar198;
      auVar16._16_4_ = fVar188 * fVar213;
      auVar16._20_4_ = fVar193 * fVar215;
      auVar16._24_4_ = fVar188 * fVar217;
      auVar16._28_4_ = local_4a0._28_4_;
      auVar165 = vfmadd213ps_fma(auVar106,auVar191,auVar16);
      auVar165 = vfmadd213ps_fma(auVar107,local_240,ZEXT1632(auVar165));
      auVar165 = vfmadd213ps_fma(auVar99,local_760,ZEXT1632(auVar165));
      local_480._0_4_ = auVar79._0_4_;
      local_480._4_4_ = auVar79._4_4_;
      fStack_478 = auVar79._8_4_;
      fStack_474 = auVar79._12_4_;
      fStack_470 = auVar79._16_4_;
      fStack_46c = auVar79._20_4_;
      fStack_468 = auVar79._24_4_;
      auVar102._0_4_ = fVar188 * (float)local_480._0_4_;
      auVar102._4_4_ = fVar193 * (float)local_480._4_4_;
      auVar102._8_4_ = fVar188 * fStack_478;
      auVar102._12_4_ = fVar193 * fStack_474;
      auVar102._16_4_ = fVar188 * fStack_470;
      auVar102._20_4_ = fVar193 * fStack_46c;
      auVar102._24_4_ = fVar188 * fStack_468;
      auVar102._28_4_ = 0;
      auVar94 = vfmadd213ps_fma(auVar98,auVar191,auVar102);
      auVar94 = vfmadd213ps_fma(auVar121,local_240,ZEXT1632(auVar94));
      auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 + 0x1210);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 + 0x1694);
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 + 0x1b18);
      fVar112 = *(float *)(bspline_basis0 + lVar86 + 0x1f9c);
      fVar114 = *(float *)(bspline_basis0 + lVar86 + 0x1fa0);
      fVar115 = *(float *)(bspline_basis0 + lVar86 + 0x1fa4);
      fVar116 = *(float *)(bspline_basis0 + lVar86 + 0x1fa8);
      fVar117 = *(float *)(bspline_basis0 + lVar86 + 0x1fac);
      fVar194 = *(float *)(bspline_basis0 + lVar86 + 0x1fb0);
      fVar196 = *(float *)(bspline_basis0 + lVar86 + 0x1fb4);
      auVar180._4_4_ = local_500 * fVar114;
      auVar180._0_4_ = local_500 * fVar112;
      auVar180._8_4_ = local_500 * fVar115;
      auVar180._12_4_ = local_500 * fVar116;
      auVar180._16_4_ = local_500 * fVar117;
      auVar180._20_4_ = local_500 * fVar194;
      auVar180._24_4_ = local_500 * fVar196;
      auVar180._28_4_ = auVar121._28_4_;
      auVar20._4_4_ = fVar114 * fVar111;
      auVar20._0_4_ = fVar112 * fVar138;
      auVar20._8_4_ = fVar115 * fVar138;
      auVar20._12_4_ = fVar116 * fVar111;
      auVar20._16_4_ = fVar117 * fVar138;
      auVar20._20_4_ = fVar194 * fVar111;
      auVar20._24_4_ = fVar196 * fVar138;
      auVar20._28_4_ = auVar119._4_4_;
      auVar21._4_4_ = fVar193 * fVar114;
      auVar21._0_4_ = fVar188 * fVar112;
      auVar21._8_4_ = fVar188 * fVar115;
      auVar21._12_4_ = fVar193 * fVar116;
      auVar21._16_4_ = fVar188 * fVar117;
      auVar21._20_4_ = fVar193 * fVar194;
      auVar21._24_4_ = fVar188 * fVar196;
      auVar21._28_4_ = fVar193;
      auVar119 = vfmadd231ps_fma(auVar180,auVar107,local_6e0);
      auVar120 = vfmadd231ps_fma(auVar20,auVar107,local_620);
      auVar151 = vfmadd231ps_fma(auVar21,auVar191,auVar107);
      auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar106,auVar190);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar106,local_580);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_240,auVar106);
      auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar98,auVar152);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar98,local_600);
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_760,auVar98);
      fVar112 = *(float *)(bspline_basis1 + lVar86 + 0x1f9c);
      fVar114 = *(float *)(bspline_basis1 + lVar86 + 0x1fa0);
      fVar115 = *(float *)(bspline_basis1 + lVar86 + 0x1fa4);
      fVar116 = *(float *)(bspline_basis1 + lVar86 + 0x1fa8);
      fVar117 = *(float *)(bspline_basis1 + lVar86 + 0x1fac);
      fVar194 = *(float *)(bspline_basis1 + lVar86 + 0x1fb0);
      fVar196 = *(float *)(bspline_basis1 + lVar86 + 0x1fb4);
      auVar106._4_4_ = local_500 * fVar114;
      auVar106._0_4_ = local_500 * fVar112;
      auVar106._8_4_ = local_500 * fVar115;
      auVar106._12_4_ = local_500 * fVar116;
      auVar106._16_4_ = local_500 * fVar117;
      auVar106._20_4_ = local_500 * fVar194;
      auVar106._24_4_ = local_500 * fVar196;
      auVar106._28_4_ = auVar93._4_4_;
      auVar22._4_4_ = fVar111 * fVar114;
      auVar22._0_4_ = fVar138 * fVar112;
      auVar22._8_4_ = fVar138 * fVar115;
      auVar22._12_4_ = fVar111 * fVar116;
      auVar22._16_4_ = fVar138 * fVar117;
      auVar22._20_4_ = fVar111 * fVar194;
      auVar22._24_4_ = fVar138 * fVar196;
      auVar22._28_4_ = local_500;
      auVar23._4_4_ = fVar114 * fVar193;
      auVar23._0_4_ = fVar112 * fVar188;
      auVar23._8_4_ = fVar115 * fVar188;
      auVar23._12_4_ = fVar116 * fVar193;
      auVar23._16_4_ = fVar117 * fVar188;
      auVar23._20_4_ = fVar194 * fVar193;
      auVar23._24_4_ = fVar196 * fVar188;
      auVar23._28_4_ = fVar111;
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 + 0x1b18);
      auVar93 = vfmadd231ps_fma(auVar106,auVar98,local_6e0);
      auVar156 = vfmadd231ps_fma(auVar22,auVar98,local_620);
      auVar91 = vfmadd231ps_fma(auVar23,auVar191,auVar98);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 + 0x1694);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar98,auVar190);
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar98,local_580);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_240,auVar98);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 + 0x1210);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar98,auVar152);
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar98,local_600);
      auVar124._8_4_ = 0x7fffffff;
      auVar124._0_8_ = 0x7fffffff7fffffff;
      auVar124._12_4_ = 0x7fffffff;
      auVar124._16_4_ = 0x7fffffff;
      auVar124._20_4_ = 0x7fffffff;
      auVar124._24_4_ = 0x7fffffff;
      auVar124._28_4_ = 0x7fffffff;
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_760,auVar98);
      auVar98 = vandps_avx(ZEXT1632(auVar119),auVar124);
      auVar121 = vandps_avx(ZEXT1632(auVar120),auVar124);
      auVar121 = vmaxps_avx(auVar98,auVar121);
      auVar98 = vandps_avx(ZEXT1632(auVar151),auVar124);
      auVar98 = vmaxps_avx(auVar121,auVar98);
      auVar148._4_4_ = fVar110;
      auVar148._0_4_ = fVar110;
      auVar148._8_4_ = fVar110;
      auVar148._12_4_ = fVar110;
      auVar148._16_4_ = fVar110;
      auVar148._20_4_ = fVar110;
      auVar148._24_4_ = fVar110;
      auVar148._28_4_ = fVar110;
      auVar98 = vcmpps_avx(auVar98,auVar148,1);
      auVar106 = vblendvps_avx(ZEXT1632(auVar119),local_520,auVar98);
      auVar107 = vblendvps_avx(ZEXT1632(auVar120),local_460,auVar98);
      auVar98 = vandps_avx(ZEXT1632(auVar93),auVar124);
      auVar121 = vandps_avx(ZEXT1632(auVar156),auVar124);
      auVar99 = vmaxps_avx(auVar98,auVar121);
      auVar98 = vandps_avx(ZEXT1632(auVar91),auVar124);
      auVar98 = vmaxps_avx(auVar99,auVar98);
      auVar170 = vcmpps_avx(auVar98,auVar148,1);
      auVar98 = vblendvps_avx(ZEXT1632(auVar93),local_520,auVar170);
      auVar99 = vblendvps_avx(ZEXT1632(auVar156),local_460,auVar170);
      auVar94 = vfmadd213ps_fma(auVar174,local_760,ZEXT1632(auVar94));
      auVar93 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar107,auVar107);
      auVar174 = vrsqrtps_avx(ZEXT1632(auVar93));
      fVar138 = auVar174._0_4_;
      fVar111 = auVar174._4_4_;
      fVar112 = auVar174._8_4_;
      fVar114 = auVar174._12_4_;
      fVar115 = auVar174._16_4_;
      fVar116 = auVar174._20_4_;
      fVar117 = auVar174._24_4_;
      auVar24._4_4_ = fVar111 * fVar111 * fVar111 * auVar93._4_4_ * -0.5;
      auVar24._0_4_ = fVar138 * fVar138 * fVar138 * auVar93._0_4_ * -0.5;
      auVar24._8_4_ = fVar112 * fVar112 * fVar112 * auVar93._8_4_ * -0.5;
      auVar24._12_4_ = fVar114 * fVar114 * fVar114 * auVar93._12_4_ * -0.5;
      auVar24._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar24._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar24._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar24._28_4_ = auVar121._28_4_;
      auVar234._8_4_ = 0x3fc00000;
      auVar234._0_8_ = 0x3fc000003fc00000;
      auVar234._12_4_ = 0x3fc00000;
      auVar234._16_4_ = 0x3fc00000;
      auVar234._20_4_ = 0x3fc00000;
      auVar234._24_4_ = 0x3fc00000;
      auVar234._28_4_ = 0x3fc00000;
      auVar93 = vfmadd231ps_fma(auVar24,auVar234,auVar174);
      fVar138 = auVar93._0_4_;
      fVar111 = auVar93._4_4_;
      auVar25._4_4_ = fVar111 * auVar107._4_4_;
      auVar25._0_4_ = fVar138 * auVar107._0_4_;
      fVar112 = auVar93._8_4_;
      auVar25._8_4_ = fVar112 * auVar107._8_4_;
      fVar114 = auVar93._12_4_;
      auVar25._12_4_ = fVar114 * auVar107._12_4_;
      auVar25._16_4_ = auVar107._16_4_ * 0.0;
      auVar25._20_4_ = auVar107._20_4_ * 0.0;
      auVar25._24_4_ = auVar107._24_4_ * 0.0;
      auVar25._28_4_ = 0;
      auVar26._4_4_ = fVar111 * -auVar106._4_4_;
      auVar26._0_4_ = fVar138 * -auVar106._0_4_;
      auVar26._8_4_ = fVar112 * -auVar106._8_4_;
      auVar26._12_4_ = fVar114 * -auVar106._12_4_;
      auVar26._16_4_ = -auVar106._16_4_ * 0.0;
      auVar26._20_4_ = -auVar106._20_4_ * 0.0;
      auVar26._24_4_ = -auVar106._24_4_ * 0.0;
      auVar26._28_4_ = auVar174._28_4_;
      auVar93 = vfmadd213ps_fma(auVar98,auVar98,ZEXT832(0) << 0x20);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar99,auVar99);
      auVar121 = vrsqrtps_avx(ZEXT1632(auVar93));
      auVar27._28_4_ = auVar170._28_4_;
      auVar27._0_28_ =
           ZEXT1628(CONCAT412(fVar114 * 0.0,
                              CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar138 * 0.0))));
      fVar138 = auVar121._0_4_;
      fVar111 = auVar121._4_4_;
      fVar112 = auVar121._8_4_;
      fVar114 = auVar121._12_4_;
      fVar115 = auVar121._16_4_;
      fVar116 = auVar121._20_4_;
      fVar117 = auVar121._24_4_;
      auVar28._4_4_ = fVar111 * fVar111 * fVar111 * auVar93._4_4_ * -0.5;
      auVar28._0_4_ = fVar138 * fVar138 * fVar138 * auVar93._0_4_ * -0.5;
      auVar28._8_4_ = fVar112 * fVar112 * fVar112 * auVar93._8_4_ * -0.5;
      auVar28._12_4_ = fVar114 * fVar114 * fVar114 * auVar93._12_4_ * -0.5;
      auVar28._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
      auVar28._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar28._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar28._28_4_ = 0;
      auVar93 = vfmadd231ps_fma(auVar28,auVar234,auVar121);
      fVar138 = auVar93._0_4_;
      auVar220._0_4_ = auVar99._0_4_ * fVar138;
      fVar111 = auVar93._4_4_;
      auVar220._4_4_ = auVar99._4_4_ * fVar111;
      fVar112 = auVar93._8_4_;
      auVar220._8_4_ = auVar99._8_4_ * fVar112;
      fVar114 = auVar93._12_4_;
      auVar220._12_4_ = auVar99._12_4_ * fVar114;
      auVar220._16_4_ = auVar99._16_4_ * 0.0;
      auVar220._20_4_ = auVar99._20_4_ * 0.0;
      auVar220._24_4_ = auVar99._24_4_ * 0.0;
      auVar220._28_4_ = 0;
      auVar29._4_4_ = -auVar98._4_4_ * fVar111;
      auVar29._0_4_ = -auVar98._0_4_ * fVar138;
      auVar29._8_4_ = -auVar98._8_4_ * fVar112;
      auVar29._12_4_ = -auVar98._12_4_ * fVar114;
      auVar29._16_4_ = -auVar98._16_4_ * 0.0;
      auVar29._20_4_ = -auVar98._20_4_ * 0.0;
      auVar29._24_4_ = -auVar98._24_4_ * 0.0;
      auVar29._28_4_ = auVar99._28_4_;
      auVar30._28_4_ = auVar121._28_4_;
      auVar30._0_28_ =
           ZEXT1628(CONCAT412(fVar114 * 0.0,
                              CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar138 * 0.0))));
      auVar93 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar139),auVar122);
      auVar98 = ZEXT1632(auVar139);
      auVar119 = vfmadd213ps_fma(auVar26,auVar98,local_440);
      auVar120 = vfmadd213ps_fma(auVar27,auVar98,ZEXT1632(auVar94));
      auVar91 = vfnmadd213ps_fma(auVar25,auVar98,auVar122);
      auVar151 = vfmadd213ps_fma(auVar220,ZEXT1632(auVar92),local_400);
      auVar118 = vfnmadd213ps_fma(auVar26,auVar98,local_440);
      auVar98 = ZEXT1632(auVar92);
      auVar156 = vfmadd213ps_fma(auVar29,auVar98,local_420);
      auVar180 = ZEXT1632(auVar139);
      auVar176 = vfnmadd231ps_fma(ZEXT1632(auVar94),auVar180,auVar27);
      auVar94 = vfmadd213ps_fma(auVar30,auVar98,ZEXT1632(auVar165));
      auVar169 = vfnmadd213ps_fma(auVar220,auVar98,local_400);
      auVar175 = vfnmadd213ps_fma(auVar29,auVar98,local_420);
      _local_5a0 = ZEXT1632(auVar92);
      auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar165),_local_5a0,auVar30);
      auVar98 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar118));
      auVar121 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar176));
      auVar122._4_4_ = auVar176._4_4_ * auVar98._4_4_;
      auVar122._0_4_ = auVar176._0_4_ * auVar98._0_4_;
      auVar122._8_4_ = auVar176._8_4_ * auVar98._8_4_;
      auVar122._12_4_ = auVar176._12_4_ * auVar98._12_4_;
      auVar122._16_4_ = auVar98._16_4_ * 0.0;
      auVar122._20_4_ = auVar98._20_4_ * 0.0;
      auVar122._24_4_ = auVar98._24_4_ * 0.0;
      auVar122._28_4_ = 0;
      auVar139 = vfmsub231ps_fma(auVar122,ZEXT1632(auVar118),auVar121);
      auVar31._4_4_ = auVar121._4_4_ * auVar91._4_4_;
      auVar31._0_4_ = auVar121._0_4_ * auVar91._0_4_;
      auVar31._8_4_ = auVar121._8_4_ * auVar91._8_4_;
      auVar31._12_4_ = auVar121._12_4_ * auVar91._12_4_;
      auVar31._16_4_ = auVar121._16_4_ * 0.0;
      auVar31._20_4_ = auVar121._20_4_ * 0.0;
      auVar31._24_4_ = auVar121._24_4_ * 0.0;
      auVar31._28_4_ = auVar121._28_4_;
      auVar121 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar91));
      auVar165 = vfmsub231ps_fma(auVar31,ZEXT1632(auVar176),auVar121);
      auVar32._4_4_ = auVar118._4_4_ * auVar121._4_4_;
      auVar32._0_4_ = auVar118._0_4_ * auVar121._0_4_;
      auVar32._8_4_ = auVar118._8_4_ * auVar121._8_4_;
      auVar32._12_4_ = auVar118._12_4_ * auVar121._12_4_;
      auVar32._16_4_ = auVar121._16_4_ * 0.0;
      auVar32._20_4_ = auVar121._20_4_ * 0.0;
      auVar32._24_4_ = auVar121._24_4_ * 0.0;
      auVar32._28_4_ = auVar121._28_4_;
      auVar170 = ZEXT1632(auVar91);
      auVar92 = vfmsub231ps_fma(auVar32,auVar170,auVar98);
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar139));
      auVar129 = vcmpps_avx(ZEXT1632(auVar165),ZEXT832(0) << 0x20,2);
      auVar98 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar93),auVar129);
      auVar121 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar119),auVar129);
      auVar174 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar120),auVar129);
      auVar106 = vblendvps_avx(auVar170,ZEXT1632(auVar151),auVar129);
      auVar107 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar156),auVar129);
      auVar99 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar94),auVar129);
      auVar170 = vblendvps_avx(ZEXT1632(auVar151),auVar170,auVar129);
      auVar100 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar118),auVar129);
      auVar165 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
      auVar17 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar176),auVar129);
      auVar182 = vsubps_avx(auVar170,auVar98);
      auVar222 = vsubps_avx(auVar100,auVar121);
      auVar101 = vsubps_avx(auVar17,auVar174);
      auVar122 = vsubps_avx(auVar98,auVar106);
      auVar123 = vsubps_avx(auVar121,auVar107);
      auVar16 = vsubps_avx(auVar174,auVar99);
      auVar33._4_4_ = auVar101._4_4_ * auVar98._4_4_;
      auVar33._0_4_ = auVar101._0_4_ * auVar98._0_4_;
      auVar33._8_4_ = auVar101._8_4_ * auVar98._8_4_;
      auVar33._12_4_ = auVar101._12_4_ * auVar98._12_4_;
      auVar33._16_4_ = auVar101._16_4_ * auVar98._16_4_;
      auVar33._20_4_ = auVar101._20_4_ * auVar98._20_4_;
      auVar33._24_4_ = auVar101._24_4_ * auVar98._24_4_;
      auVar33._28_4_ = auVar17._28_4_;
      auVar94 = vfmsub231ps_fma(auVar33,auVar174,auVar182);
      auVar34._4_4_ = auVar182._4_4_ * auVar121._4_4_;
      auVar34._0_4_ = auVar182._0_4_ * auVar121._0_4_;
      auVar34._8_4_ = auVar182._8_4_ * auVar121._8_4_;
      auVar34._12_4_ = auVar182._12_4_ * auVar121._12_4_;
      auVar34._16_4_ = auVar182._16_4_ * auVar121._16_4_;
      auVar34._20_4_ = auVar182._20_4_ * auVar121._20_4_;
      auVar34._24_4_ = auVar182._24_4_ * auVar121._24_4_;
      auVar34._28_4_ = auVar170._28_4_;
      auVar93 = vfmsub231ps_fma(auVar34,auVar98,auVar222);
      auVar72 = ZEXT812(0);
      auVar221 = ZEXT1232(auVar72) << 0x20;
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1232(auVar72) << 0x20,ZEXT1632(auVar94));
      auVar103._0_4_ = auVar222._0_4_ * auVar174._0_4_;
      auVar103._4_4_ = auVar222._4_4_ * auVar174._4_4_;
      auVar103._8_4_ = auVar222._8_4_ * auVar174._8_4_;
      auVar103._12_4_ = auVar222._12_4_ * auVar174._12_4_;
      auVar103._16_4_ = auVar222._16_4_ * auVar174._16_4_;
      auVar103._20_4_ = auVar222._20_4_ * auVar174._20_4_;
      auVar103._24_4_ = auVar222._24_4_ * auVar174._24_4_;
      auVar103._28_4_ = 0;
      auVar93 = vfmsub231ps_fma(auVar103,auVar121,auVar101);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1232(auVar72) << 0x20,ZEXT1632(auVar93));
      auVar104._0_4_ = auVar16._0_4_ * auVar106._0_4_;
      auVar104._4_4_ = auVar16._4_4_ * auVar106._4_4_;
      auVar104._8_4_ = auVar16._8_4_ * auVar106._8_4_;
      auVar104._12_4_ = auVar16._12_4_ * auVar106._12_4_;
      auVar104._16_4_ = auVar16._16_4_ * auVar106._16_4_;
      auVar104._20_4_ = auVar16._20_4_ * auVar106._20_4_;
      auVar104._24_4_ = auVar16._24_4_ * auVar106._24_4_;
      auVar104._28_4_ = 0;
      auVar94 = vfmsub231ps_fma(auVar104,auVar122,auVar99);
      auVar35._4_4_ = auVar123._4_4_ * auVar99._4_4_;
      auVar35._0_4_ = auVar123._0_4_ * auVar99._0_4_;
      auVar35._8_4_ = auVar123._8_4_ * auVar99._8_4_;
      auVar35._12_4_ = auVar123._12_4_ * auVar99._12_4_;
      auVar35._16_4_ = auVar123._16_4_ * auVar99._16_4_;
      auVar35._20_4_ = auVar123._20_4_ * auVar99._20_4_;
      auVar35._24_4_ = auVar123._24_4_ * auVar99._24_4_;
      auVar35._28_4_ = auVar99._28_4_;
      auVar119 = vfmsub231ps_fma(auVar35,auVar107,auVar16);
      auVar36._4_4_ = auVar122._4_4_ * auVar107._4_4_;
      auVar36._0_4_ = auVar122._0_4_ * auVar107._0_4_;
      auVar36._8_4_ = auVar122._8_4_ * auVar107._8_4_;
      auVar36._12_4_ = auVar122._12_4_ * auVar107._12_4_;
      auVar36._16_4_ = auVar122._16_4_ * auVar107._16_4_;
      auVar36._20_4_ = auVar122._20_4_ * auVar107._20_4_;
      auVar36._24_4_ = auVar122._24_4_ * auVar107._24_4_;
      auVar36._28_4_ = auVar100._28_4_;
      auVar139 = vfmsub231ps_fma(auVar36,auVar123,auVar106);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT1232(auVar72) << 0x20,ZEXT1632(auVar94));
      auVar119 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1232(auVar72) << 0x20,ZEXT1632(auVar119));
      auVar106 = vmaxps_avx(ZEXT1632(auVar93),ZEXT1632(auVar119));
      auVar106 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,2);
      auVar94 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
      auVar165 = vpand_avx(auVar94,auVar165);
      auVar106 = vpmovsxwd_avx2(auVar165);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        auVar137 = ZEXT864(0) << 0x20;
LAB_0112ae6e:
        auVar155 = ZEXT3264(CONCAT824(local_6a0[1]._24_8_,
                                      CONCAT816(local_6a0[1]._16_8_,
                                                CONCAT88(local_6a0[1]._8_8_,local_6a0[1]._0_8_))));
        auVar98 = vpcmpeqd_avx2(auVar221,auVar221);
        auVar208 = ZEXT3264(auVar98);
      }
      else {
        auVar37._4_4_ = auVar222._4_4_ * auVar16._4_4_;
        auVar37._0_4_ = auVar222._0_4_ * auVar16._0_4_;
        auVar37._8_4_ = auVar222._8_4_ * auVar16._8_4_;
        auVar37._12_4_ = auVar222._12_4_ * auVar16._12_4_;
        auVar37._16_4_ = auVar222._16_4_ * auVar16._16_4_;
        auVar37._20_4_ = auVar222._20_4_ * auVar16._20_4_;
        auVar37._24_4_ = auVar222._24_4_ * auVar16._24_4_;
        auVar37._28_4_ = auVar106._28_4_;
        auVar120 = vfmsub231ps_fma(auVar37,auVar123,auVar101);
        auVar125._0_4_ = auVar101._0_4_ * auVar122._0_4_;
        auVar125._4_4_ = auVar101._4_4_ * auVar122._4_4_;
        auVar125._8_4_ = auVar101._8_4_ * auVar122._8_4_;
        auVar125._12_4_ = auVar101._12_4_ * auVar122._12_4_;
        auVar125._16_4_ = auVar101._16_4_ * auVar122._16_4_;
        auVar125._20_4_ = auVar101._20_4_ * auVar122._20_4_;
        auVar125._24_4_ = auVar101._24_4_ * auVar122._24_4_;
        auVar125._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar125,auVar182,auVar16);
        auVar38._4_4_ = auVar182._4_4_ * auVar123._4_4_;
        auVar38._0_4_ = auVar182._0_4_ * auVar123._0_4_;
        auVar38._8_4_ = auVar182._8_4_ * auVar123._8_4_;
        auVar38._12_4_ = auVar182._12_4_ * auVar123._12_4_;
        auVar38._16_4_ = auVar182._16_4_ * auVar123._16_4_;
        auVar38._20_4_ = auVar182._20_4_ * auVar123._20_4_;
        auVar38._24_4_ = auVar182._24_4_ * auVar123._24_4_;
        auVar38._28_4_ = auVar107._28_4_;
        auVar151 = vfmsub231ps_fma(auVar38,auVar122,auVar222);
        auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar151));
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar120),_DAT_01f7b000);
        auVar106 = vrcpps_avx(ZEXT1632(auVar139));
        auVar221._8_4_ = 0x3f800000;
        auVar221._0_8_ = 0x3f8000003f800000;
        auVar221._12_4_ = 0x3f800000;
        auVar221._16_4_ = 0x3f800000;
        auVar221._20_4_ = 0x3f800000;
        auVar221._24_4_ = 0x3f800000;
        auVar221._28_4_ = 0x3f800000;
        auVar94 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar139),auVar221);
        auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar106,auVar106);
        auVar181._0_4_ = auVar151._0_4_ * auVar174._0_4_;
        auVar181._4_4_ = auVar151._4_4_ * auVar174._4_4_;
        auVar181._8_4_ = auVar151._8_4_ * auVar174._8_4_;
        auVar181._12_4_ = auVar151._12_4_ * auVar174._12_4_;
        auVar181._16_4_ = auVar174._16_4_ * 0.0;
        auVar181._20_4_ = auVar174._20_4_ * 0.0;
        auVar181._24_4_ = auVar174._24_4_ * 0.0;
        auVar181._28_4_ = 0;
        auVar92 = vfmadd231ps_fma(auVar181,auVar121,ZEXT1632(auVar92));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar120),auVar98);
        fVar138 = auVar94._0_4_;
        fVar111 = auVar94._4_4_;
        fVar112 = auVar94._8_4_;
        fVar114 = auVar94._12_4_;
        auVar174 = ZEXT1632(CONCAT412(fVar114 * auVar92._12_4_,
                                      CONCAT48(fVar112 * auVar92._8_4_,
                                               CONCAT44(fVar111 * auVar92._4_4_,
                                                        fVar138 * auVar92._0_4_))));
        auVar105._4_4_ = uVar88;
        auVar105._0_4_ = uVar88;
        auVar105._8_4_ = uVar88;
        auVar105._12_4_ = uVar88;
        auVar105._16_4_ = uVar88;
        auVar105._20_4_ = uVar88;
        auVar105._24_4_ = uVar88;
        auVar105._28_4_ = uVar88;
        uVar224 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar126._4_4_ = uVar224;
        auVar126._0_4_ = uVar224;
        auVar126._8_4_ = uVar224;
        auVar126._12_4_ = uVar224;
        auVar126._16_4_ = uVar224;
        auVar126._20_4_ = uVar224;
        auVar126._24_4_ = uVar224;
        auVar126._28_4_ = uVar224;
        auVar98 = vcmpps_avx(auVar105,auVar174,2);
        auVar121 = vcmpps_avx(auVar174,auVar126,2);
        auVar98 = vandps_avx(auVar121,auVar98);
        auVar94 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar165 = vpand_avx(auVar165,auVar94);
        auVar98 = vpmovsxwd_avx2(auVar165);
        auVar137 = ZEXT864(0) << 0x20;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) goto LAB_0112ae6e;
        auVar98 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar139),4);
        auVar94 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
        auVar165 = vpand_avx(auVar165,auVar94);
        auVar121 = vpmovsxwd_avx2(auVar165);
        auVar155 = ZEXT3264(CONCAT824(local_6a0[1]._24_8_,
                                      CONCAT816(local_6a0[1]._16_8_,
                                                CONCAT88(local_6a0[1]._8_8_,local_6a0[1]._0_8_))));
        auVar98 = vpcmpeqd_avx2(auVar221,auVar221);
        auVar208 = ZEXT3264(auVar98);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar106 = ZEXT1632(CONCAT412(fVar114 * auVar93._12_4_,
                                        CONCAT48(fVar112 * auVar93._8_4_,
                                                 CONCAT44(fVar111 * auVar93._4_4_,
                                                          fVar138 * auVar93._0_4_))));
          auVar107 = ZEXT1632(CONCAT412(fVar114 * auVar119._12_4_,
                                        CONCAT48(fVar112 * auVar119._8_4_,
                                                 CONCAT44(fVar111 * auVar119._4_4_,
                                                          fVar138 * auVar119._0_4_))));
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar168._16_4_ = 0x3f800000;
          auVar168._20_4_ = 0x3f800000;
          auVar168._24_4_ = 0x3f800000;
          auVar168._28_4_ = 0x3f800000;
          auVar98 = vsubps_avx(auVar168,auVar106);
          _local_260 = vblendvps_avx(auVar98,auVar106,auVar129);
          auVar98 = vsubps_avx(auVar168,auVar107);
          local_4c0 = vblendvps_avx(auVar98,auVar107,auVar129);
          auVar155 = ZEXT3264(auVar121);
          local_5c0 = auVar174;
        }
      }
      auVar231 = ZEXT3264(local_760);
      auVar229 = ZEXT3264(_local_7e0);
      auVar98 = auVar155._0_32_;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar155 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar155 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar155[0x1f]) {
        auVar137 = ZEXT3264(local_780);
        auVar155 = ZEXT3264(local_6e0);
      }
      else {
        auVar121 = vsubps_avx(_local_5a0,auVar180);
        auVar165 = vfmadd213ps_fma(auVar121,_local_260,auVar180);
        fVar138 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar39._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar138;
        auVar39._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar138;
        auVar39._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar138;
        auVar39._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar138;
        auVar39._16_4_ = fVar138 * 0.0;
        auVar39._20_4_ = fVar138 * 0.0;
        auVar39._24_4_ = fVar138 * 0.0;
        auVar39._28_4_ = 0;
        auVar121 = vcmpps_avx(local_5c0,auVar39,6);
        auVar174 = auVar98 & auVar121;
        auVar155 = ZEXT3264(auVar191);
        if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar174 >> 0x7f,0) != '\0') ||
              (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0xbf,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar174[0x1f] < '\0') {
          auVar127._8_4_ = 0xbf800000;
          auVar127._0_8_ = 0xbf800000bf800000;
          auVar127._12_4_ = 0xbf800000;
          auVar127._16_4_ = 0xbf800000;
          auVar127._20_4_ = 0xbf800000;
          auVar127._24_4_ = 0xbf800000;
          auVar127._28_4_ = 0xbf800000;
          auVar149._8_4_ = 0x40000000;
          auVar149._0_8_ = 0x4000000040000000;
          auVar149._12_4_ = 0x40000000;
          auVar149._16_4_ = 0x40000000;
          auVar149._20_4_ = 0x40000000;
          auVar149._24_4_ = 0x40000000;
          auVar149._28_4_ = 0x40000000;
          auVar165 = vfmadd213ps_fma(local_4c0,auVar149,auVar127);
          local_3c0 = _local_260;
          local_3a0 = ZEXT1632(auVar165);
          local_380 = local_5c0;
          local_360 = 0;
          local_340 = local_870;
          uStack_338 = uStack_868;
          local_330 = local_880;
          uStack_328 = uStack_878;
          local_320 = local_890;
          uStack_318 = uStack_888;
          local_4c0 = local_3a0;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_6c0 = vandps_avx(auVar121,auVar98);
            fVar138 = 1.0 / (float)local_540._0_4_;
            local_2e0[0] = fVar138 * ((float)local_260._0_4_ + 0.0);
            local_2e0[1] = fVar138 * ((float)local_260._4_4_ + 1.0);
            local_2e0[2] = fVar138 * (fStack_258 + 2.0);
            local_2e0[3] = fVar138 * (fStack_254 + 3.0);
            fStack_2d0 = fVar138 * (fStack_250 + 4.0);
            fStack_2cc = fVar138 * (fStack_24c + 5.0);
            fStack_2c8 = fVar138 * (fStack_248 + 6.0);
            fStack_2c4 = fStack_244 + 7.0;
            local_4c0._0_8_ = auVar165._0_8_;
            local_4c0._8_8_ = auVar165._8_8_;
            local_2c0 = local_4c0._0_8_;
            uStack_2b8 = local_4c0._8_8_;
            uStack_2b0 = 0;
            uStack_2a8 = 0;
            local_2a0 = local_5c0;
            auVar128._8_4_ = 0x7f800000;
            auVar128._0_8_ = 0x7f8000007f800000;
            auVar128._12_4_ = 0x7f800000;
            auVar128._16_4_ = 0x7f800000;
            auVar128._20_4_ = 0x7f800000;
            auVar128._24_4_ = 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar128,local_5c0,local_6c0);
            auVar121 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar121 = vminps_avx(auVar98,auVar121);
            auVar174 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar174);
            auVar174 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar174);
            auVar121 = vcmpps_avx(auVar98,auVar121,0);
            auVar174 = local_6c0 & auVar121;
            auVar98 = local_6c0;
            if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar174 >> 0x7f,0) != '\0') ||
                  (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar174 >> 0xbf,0) != '\0') ||
                (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar174[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar121,local_6c0);
            }
            uVar82 = vmovmskps_avx(auVar98);
            uVar18 = 0;
            for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
              uVar18 = uVar18 + 1;
            }
            uVar84 = (ulong)uVar18;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar138 = local_2e0[uVar84];
              uVar224 = *(undefined4 *)((long)&local_2c0 + uVar84 * 4);
              fVar111 = 1.0 - fVar138;
              auVar160 = ZEXT416((uint)(fVar138 * fVar111 * 4.0));
              auVar165 = vfnmsub213ss_fma(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),auVar160);
              auVar160 = vfmadd213ss_fma(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),auVar160);
              fVar111 = fVar111 * -fVar111 * 0.5;
              fVar112 = auVar165._0_4_ * 0.5;
              fVar114 = auVar160._0_4_ * 0.5;
              fVar115 = fVar138 * fVar138 * 0.5;
              auVar158._0_4_ = fVar115 * fVar113;
              auVar158._4_4_ = fVar115 * fVar73;
              auVar158._8_4_ = fVar115 * fVar74;
              auVar158._12_4_ = fVar115 * fVar75;
              auVar140._4_4_ = fVar114;
              auVar140._0_4_ = fVar114;
              auVar140._8_4_ = fVar114;
              auVar140._12_4_ = fVar114;
              auVar160 = vfmadd132ps_fma(auVar140,auVar158,auVar15);
              auVar159._4_4_ = fVar112;
              auVar159._0_4_ = fVar112;
              auVar159._8_4_ = fVar112;
              auVar159._12_4_ = fVar112;
              auVar160 = vfmadd132ps_fma(auVar159,auVar160,auVar14);
              auVar141._4_4_ = fVar111;
              auVar141._0_4_ = fVar111;
              auVar141._8_4_ = fVar111;
              auVar141._12_4_ = fVar111;
              auVar160 = vfmadd132ps_fma(auVar141,auVar160,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar84 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar160._0_4_;
              uVar8 = vextractps_avx(auVar160,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
              uVar8 = vextractps_avx(auVar160,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
              *(float *)(ray + k * 4 + 0x1e0) = fVar138;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar224;
              *(uint *)(ray + k * 4 + 0x220) = uVar81;
              *(uint *)(ray + k * 4 + 0x240) = uVar7;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_7c0._4_4_ = uVar7;
              local_7c0._0_4_ = uVar7;
              local_7c0._8_4_ = uVar7;
              local_7c0._12_4_ = uVar7;
              local_7c0._16_4_ = uVar7;
              local_7c0._20_4_ = uVar7;
              local_7c0._24_4_ = uVar7;
              local_7c0._28_4_ = uVar7;
              local_700._4_4_ = uVar81;
              local_700._0_4_ = uVar81;
              local_700._8_4_ = uVar81;
              local_700._12_4_ = uVar81;
              local_700._16_4_ = uVar81;
              local_700._20_4_ = uVar81;
              local_700._24_4_ = uVar81;
              local_700._28_4_ = uVar81;
              uVar224 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_740 = auVar191;
              _local_480 = *pauVar2;
              local_35c = iVar80;
              local_350 = uVar76;
              uStack_348 = uVar77;
              while( true ) {
                fVar138 = local_2e0[uVar84];
                auVar97._4_4_ = fVar138;
                auVar97._0_4_ = fVar138;
                auVar97._8_4_ = fVar138;
                auVar97._12_4_ = fVar138;
                local_1c0._16_4_ = fVar138;
                local_1c0._0_16_ = auVar97;
                local_1c0._20_4_ = fVar138;
                local_1c0._24_4_ = fVar138;
                local_1c0._28_4_ = fVar138;
                local_1a0 = *(undefined4 *)((long)&local_2c0 + uVar84 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar84 * 4);
                fVar112 = 1.0 - fVar138;
                auVar165 = ZEXT416((uint)(fVar138 * fVar112 * 4.0));
                auVar94 = vfnmsub213ss_fma(auVar97,auVar97,auVar165);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),auVar165);
                fVar111 = auVar165._0_4_ * 0.5;
                fVar138 = fVar138 * fVar138 * 0.5;
                auVar166._0_4_ = fVar138 * fVar113;
                auVar166._4_4_ = fVar138 * fVar73;
                auVar166._8_4_ = fVar138 * fVar74;
                auVar166._12_4_ = fVar138 * fVar75;
                auVar146._4_4_ = fVar111;
                auVar146._0_4_ = fVar111;
                auVar146._8_4_ = fVar111;
                auVar146._12_4_ = fVar111;
                auVar165 = vfmadd132ps_fma(auVar146,auVar166,auVar15);
                fVar138 = auVar94._0_4_ * 0.5;
                auVar167._4_4_ = fVar138;
                auVar167._0_4_ = fVar138;
                auVar167._8_4_ = fVar138;
                auVar167._12_4_ = fVar138;
                auVar165 = vfmadd132ps_fma(auVar167,auVar165,auVar14);
                local_810.context = context->user;
                fVar138 = fVar112 * -fVar112 * 0.5;
                auVar147._4_4_ = fVar138;
                auVar147._0_4_ = fVar138;
                auVar147._8_4_ = fVar138;
                auVar147._12_4_ = fVar138;
                auVar94 = vfmadd132ps_fma(auVar147,auVar165,auVar160);
                local_220 = auVar94._0_4_;
                uStack_21c = local_220;
                uStack_218 = local_220;
                uStack_214 = local_220;
                uStack_210 = local_220;
                uStack_20c = local_220;
                uStack_208 = local_220;
                uStack_204 = local_220;
                auVar165 = vmovshdup_avx(auVar94);
                local_200 = auVar165._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                auVar165 = vshufps_avx(auVar94,auVar94,0xaa);
                local_1e0 = auVar165._0_8_;
                uStack_1d8 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = local_700._0_8_;
                uStack_178 = local_700._8_8_;
                uStack_170 = local_700._16_8_;
                uStack_168 = local_700._24_8_;
                local_160 = local_7c0._0_8_;
                uStack_158 = local_7c0._8_8_;
                uStack_150 = local_7c0._16_8_;
                uStack_148 = local_7c0._24_8_;
                local_788[1] = auVar208._0_32_;
                *local_788 = auVar208._0_32_;
                local_140 = (local_810.context)->instID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_120 = (local_810.context)->instPrimID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_6a0[0] = local_280;
                local_810.valid = (int *)local_6a0;
                local_810.geometryUserPtr = *(void **)(CONCAT44(uStack_65c,local_660) + 0x18);
                local_810.hit = (RTCHitN *)&local_220;
                local_810.N = 8;
                pcVar11 = *(code **)(CONCAT44(uStack_65c,local_660) + 0x40);
                local_810.ray = (RTCRayN *)ray;
                if (pcVar11 != (code *)0x0) {
                  auVar98 = ZEXT1632(auVar208._0_16_);
                  (*pcVar11)(&local_810);
                  auVar229 = ZEXT3264(_local_7e0);
                  auVar155 = ZEXT3264(local_740);
                  auVar231 = ZEXT3264(local_760);
                  auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                  auVar208 = ZEXT3264(auVar98);
                  auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar121 = vpcmpeqd_avx2(auVar137._0_32_,local_6a0[0]);
                auVar98 = auVar208._0_32_ & ~auVar121;
                if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0x7f,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0xbf,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar98[0x1f]) {
                  auVar121 = auVar208._0_32_ ^ auVar121;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_65c,local_660) + 0x3e) & 0x40) != 0)))) {
                    auVar98 = ZEXT1632(auVar208._0_16_);
                    (*p_Var10)(&local_810);
                    auVar229 = ZEXT3264(_local_7e0);
                    auVar155 = ZEXT3264(local_740);
                    auVar231 = ZEXT3264(local_760);
                    auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                    auVar208 = ZEXT3264(auVar98);
                    auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar174 = vpcmpeqd_avx2(auVar137._0_32_,local_6a0[0]);
                  auVar121 = auVar208._0_32_ ^ auVar174;
                  auVar98 = auVar208._0_32_ & ~auVar174;
                  if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar98 >> 0x7f,0) != '\0') ||
                        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar98 >> 0xbf,0) != '\0') ||
                      (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar98[0x1f] < '\0') {
                    auVar135._0_4_ = auVar208._0_4_ ^ auVar174._0_4_;
                    auVar135._4_4_ = auVar208._4_4_ ^ auVar174._4_4_;
                    auVar135._8_4_ = auVar208._8_4_ ^ auVar174._8_4_;
                    auVar135._12_4_ = auVar208._12_4_ ^ auVar174._12_4_;
                    auVar135._16_4_ = auVar208._16_4_ ^ auVar174._16_4_;
                    auVar135._20_4_ = auVar208._20_4_ ^ auVar174._20_4_;
                    auVar135._24_4_ = auVar208._24_4_ ^ auVar174._24_4_;
                    auVar135._28_4_ = auVar208._28_4_ ^ auVar174._28_4_;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])local_810.hit);
                    *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x20));
                    *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x40));
                    *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x60));
                    *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar98;
                    auVar98 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x80));
                    *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar98;
                    auVar98 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])(local_810.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar98;
                  }
                }
                auVar98 = local_5c0;
                auVar191 = auVar155._0_32_;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar121 >> 0x7f,0) == '\0') &&
                      (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar121 >> 0xbf,0) == '\0') &&
                    (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar121[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar224;
                }
                else {
                  uVar224 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_6c0 + uVar84 * 4) = 0;
                auVar109._4_4_ = uVar224;
                auVar109._0_4_ = uVar224;
                auVar109._8_4_ = uVar224;
                auVar109._12_4_ = uVar224;
                auVar109._16_4_ = uVar224;
                auVar109._20_4_ = uVar224;
                auVar109._24_4_ = uVar224;
                auVar109._28_4_ = uVar224;
                auVar174 = vcmpps_avx(auVar98,auVar109,2);
                auVar121 = vandps_avx(auVar174,local_6c0);
                local_6c0 = local_6c0 & auVar174;
                if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                      (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                    (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_6c0[0x1f]) break;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar98 = vblendvps_avx(auVar136,auVar98,auVar121);
                auVar174 = vshufps_avx(auVar98,auVar98,0xb1);
                auVar174 = vminps_avx(auVar98,auVar174);
                auVar106 = vshufpd_avx(auVar174,auVar174,5);
                auVar174 = vminps_avx(auVar174,auVar106);
                auVar106 = vpermpd_avx2(auVar174,0x4e);
                auVar174 = vminps_avx(auVar174,auVar106);
                auVar174 = vcmpps_avx(auVar98,auVar174,0);
                auVar106 = auVar121 & auVar174;
                auVar98 = auVar121;
                if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0x7f,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0xbf,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar106[0x1f] < '\0') {
                  auVar98 = vandps_avx(auVar174,auVar121);
                }
                uVar82 = vmovmskps_avx(auVar98);
                uVar18 = 0;
                for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                uVar84 = (ulong)uVar18;
                local_6c0 = auVar121;
              }
            }
          }
        }
        auVar137 = ZEXT3264(local_780);
        auVar155 = ZEXT3264(local_6e0);
      }
    }
    auVar223 = ZEXT3264(local_620);
    auVar208 = ZEXT3264(CONCAT428(fStack_4e4,
                                  CONCAT424(fStack_4e8,
                                            CONCAT420(fStack_4ec,
                                                      CONCAT416(fStack_4f0,
                                                                CONCAT412(fStack_4f4,
                                                                          CONCAT48(fStack_4f8,
                                                                                   CONCAT44(
                                                  fStack_4fc,local_500))))))));
    if (8 < iVar80) {
      local_440._4_4_ = iVar80;
      local_440._0_4_ = iVar80;
      local_440._8_4_ = iVar80;
      local_440._12_4_ = iVar80;
      local_440._16_4_ = iVar80;
      local_440._20_4_ = iVar80;
      local_440._24_4_ = iVar80;
      local_440._28_4_ = iVar80;
      local_4a0._4_4_ = fVar110;
      local_4a0._0_4_ = fVar110;
      fStack_498 = fVar110;
      fStack_494 = fVar110;
      fStack_490 = fVar110;
      fStack_48c = fVar110;
      fStack_488 = fVar110;
      fStack_484 = fVar110;
      local_100 = 1.0 / (float)local_540._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      local_540._4_4_ = local_640._0_4_;
      local_540._0_4_ = local_640._0_4_;
      uStack_538._0_4_ = local_640._0_4_;
      uStack_538._4_4_ = local_640._0_4_;
      uStack_530 = local_640._0_4_;
      uStack_52c = local_640._0_4_;
      uStack_528 = local_640._0_4_;
      uStack_524 = local_640._0_4_;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      local_760 = auVar231._0_32_;
      _local_7e0 = auVar229._0_32_;
      fVar138 = (float)local_720;
      fVar110 = local_720._4_4_;
      fVar111 = (float)uStack_718;
      fVar112 = uStack_718._4_4_;
      fVar114 = (float)uStack_710;
      fVar115 = uStack_710._4_4_;
      fVar116 = (float)uStack_708;
      uVar224 = uStack_708._4_4_;
      local_740 = auVar191;
      local_660 = uVar88;
      uStack_65c = uVar88;
      uStack_658 = uVar88;
      uStack_654 = uVar88;
      uStack_650 = uVar88;
      uStack_64c = uVar88;
      uStack_648 = uVar88;
      uStack_644 = uVar88;
      for (lVar87 = 8; local_780 = auVar137._0_32_, lVar87 < iVar80; lVar87 = lVar87 + 8) {
        auVar98 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 * 4 + lVar86);
        auVar121 = *(undefined1 (*) [32])(lVar86 + 0x21fffac + lVar87 * 4);
        auVar174 = *(undefined1 (*) [32])(lVar86 + 0x2200430 + lVar87 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar86 + 0x22008b4 + lVar87 * 4);
        fVar117 = *(float *)*pauVar2;
        fVar194 = *(float *)(*pauVar2 + 4);
        fVar196 = *(float *)(*pauVar2 + 8);
        fVar198 = *(float *)(*pauVar2 + 0xc);
        fVar213 = *(float *)(*pauVar2 + 0x10);
        fVar215 = *(float *)(*pauVar2 + 0x14);
        fVar217 = *(float *)(*pauVar2 + 0x18);
        auVar79 = *(undefined1 (*) [28])*pauVar2;
        fVar202 = auVar208._0_4_;
        auVar230._0_4_ = fVar202 * fVar117;
        fVar209 = auVar208._4_4_;
        auVar230._4_4_ = fVar209 * fVar194;
        fVar210 = auVar208._8_4_;
        auVar230._8_4_ = fVar210 * fVar196;
        fVar211 = auVar208._12_4_;
        auVar230._12_4_ = fVar211 * fVar198;
        fVar212 = auVar208._16_4_;
        auVar230._16_4_ = fVar212 * fVar213;
        fVar214 = auVar208._20_4_;
        auVar230._20_4_ = fVar214 * fVar215;
        fVar216 = auVar208._24_4_;
        auVar230._28_36_ = auVar229._28_36_;
        auVar230._24_4_ = fVar216 * fVar217;
        auVar229._0_4_ = fVar117 * fVar138;
        auVar229._4_4_ = fVar194 * fVar110;
        auVar229._8_4_ = fVar196 * fVar111;
        auVar229._12_4_ = fVar198 * fVar112;
        auVar229._16_4_ = fVar213 * fVar114;
        auVar229._20_4_ = fVar215 * fVar115;
        auVar229._28_36_ = auVar231._28_36_;
        auVar229._24_4_ = fVar217 * fVar116;
        auVar160 = vfmadd231ps_fma(auVar230._0_32_,auVar174,auVar155._0_32_);
        auVar222 = auVar223._0_32_;
        auVar165 = vfmadd231ps_fma(auVar229._0_32_,auVar174,auVar222);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar121,auVar190);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar121,local_580);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar98,auVar152);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar98,local_600);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 * 4 + lVar86);
        auVar107 = *(undefined1 (*) [32])(lVar86 + 0x22023cc + lVar87 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar86 + 0x2202850 + lVar87 * 4);
        pfVar3 = (float *)(lVar86 + 0x2202cd4 + lVar87 * 4);
        fVar188 = *pfVar3;
        fVar193 = pfVar3[1];
        fVar195 = pfVar3[2];
        fVar197 = pfVar3[3];
        fVar199 = pfVar3[4];
        fVar200 = pfVar3[5];
        fVar201 = pfVar3[6];
        auVar40._4_4_ = fVar209 * fVar193;
        auVar40._0_4_ = fVar202 * fVar188;
        auVar40._8_4_ = fVar210 * fVar195;
        auVar40._12_4_ = fVar211 * fVar197;
        auVar40._16_4_ = fVar212 * fVar199;
        auVar40._20_4_ = fVar214 * fVar200;
        auVar40._24_4_ = fVar216 * fVar201;
        auVar40._28_4_ = auVar98._28_4_;
        auVar41._4_4_ = fVar110 * fVar193;
        auVar41._0_4_ = fVar138 * fVar188;
        auVar41._8_4_ = fVar111 * fVar195;
        auVar41._12_4_ = fVar112 * fVar197;
        auVar41._16_4_ = fVar114 * fVar199;
        auVar41._20_4_ = fVar115 * fVar200;
        auVar41._24_4_ = fVar116 * fVar201;
        auVar41._28_4_ = uVar224;
        auVar94 = vfmadd231ps_fma(auVar40,auVar99,auVar155._0_32_);
        auVar93 = vfmadd231ps_fma(auVar41,auVar99,auVar222);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar107,auVar190);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar107,local_580);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,auVar152);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar106,local_600);
        auVar182 = ZEXT1632(auVar94);
        local_700 = ZEXT1632(auVar160);
        local_400 = vsubps_avx(auVar182,local_700);
        auVar129 = ZEXT1632(auVar93);
        local_640 = ZEXT1632(auVar165);
        local_420 = vsubps_avx(auVar129,local_640);
        auVar42._4_4_ = auVar165._4_4_ * local_400._4_4_;
        auVar42._0_4_ = auVar165._0_4_ * local_400._0_4_;
        auVar42._8_4_ = auVar165._8_4_ * local_400._8_4_;
        auVar42._12_4_ = auVar165._12_4_ * local_400._12_4_;
        auVar42._16_4_ = local_400._16_4_ * 0.0;
        auVar42._20_4_ = local_400._20_4_ * 0.0;
        auVar42._24_4_ = local_400._24_4_ * 0.0;
        auVar42._28_4_ = local_600._28_4_;
        fVar138 = local_420._0_4_;
        auVar130._0_4_ = auVar160._0_4_ * fVar138;
        fVar110 = local_420._4_4_;
        auVar130._4_4_ = auVar160._4_4_ * fVar110;
        fVar111 = local_420._8_4_;
        auVar130._8_4_ = auVar160._8_4_ * fVar111;
        fVar112 = local_420._12_4_;
        auVar130._12_4_ = auVar160._12_4_ * fVar112;
        fVar114 = local_420._16_4_;
        auVar130._16_4_ = fVar114 * 0.0;
        fVar115 = local_420._20_4_;
        auVar130._20_4_ = fVar115 * 0.0;
        fVar116 = local_420._24_4_;
        auVar130._24_4_ = fVar116 * 0.0;
        auVar130._28_4_ = 0;
        auVar229 = ZEXT3264(auVar174);
        auVar100 = vsubps_avx(auVar42,auVar130);
        auVar43._4_4_ = local_e0._4_4_ * fVar194;
        auVar43._0_4_ = (float)local_e0 * fVar117;
        auVar43._8_4_ = (float)uStack_d8 * fVar196;
        auVar43._12_4_ = uStack_d8._4_4_ * fVar198;
        auVar43._16_4_ = (float)uStack_d0 * fVar213;
        auVar43._20_4_ = uStack_d0._4_4_ * fVar215;
        auVar43._24_4_ = (float)uStack_c8 * fVar217;
        auVar43._28_4_ = 0;
        auVar160 = vfmadd231ps_fma(auVar43,auVar174,local_c0);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),local_a0,auVar121);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),local_80,auVar98);
        auVar44._4_4_ = local_e0._4_4_ * fVar193;
        auVar44._0_4_ = (float)local_e0 * fVar188;
        auVar44._8_4_ = (float)uStack_d8 * fVar195;
        auVar44._12_4_ = uStack_d8._4_4_ * fVar197;
        auVar44._16_4_ = (float)uStack_d0 * fVar199;
        auVar44._20_4_ = uStack_d0._4_4_ * fVar200;
        auVar44._24_4_ = (float)uStack_c8 * fVar201;
        auVar44._28_4_ = uStack_c8._4_4_;
        auVar165 = vfmadd231ps_fma(auVar44,auVar99,local_c0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar107,local_a0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar106,local_80);
        auVar231 = ZEXT1664(auVar165);
        auVar137._0_4_ = fVar138 * fVar138;
        auVar137._4_4_ = fVar110 * fVar110;
        auVar137._8_4_ = fVar111 * fVar111;
        auVar137._12_4_ = fVar112 * fVar112;
        auVar137._16_4_ = fVar114 * fVar114;
        auVar137._20_4_ = fVar115 * fVar115;
        auVar137._28_36_ = auVar208._28_36_;
        auVar137._24_4_ = fVar116 * fVar116;
        auVar94 = vfmadd231ps_fma(auVar137._0_32_,local_400,local_400);
        local_520 = ZEXT1632(auVar160);
        auVar101 = ZEXT1632(auVar165);
        auVar170 = vmaxps_avx(local_520,auVar101);
        auVar205._0_4_ = auVar170._0_4_ * auVar170._0_4_ * auVar94._0_4_;
        auVar205._4_4_ = auVar170._4_4_ * auVar170._4_4_ * auVar94._4_4_;
        auVar205._8_4_ = auVar170._8_4_ * auVar170._8_4_ * auVar94._8_4_;
        auVar205._12_4_ = auVar170._12_4_ * auVar170._12_4_ * auVar94._12_4_;
        auVar205._16_4_ = auVar170._16_4_ * auVar170._16_4_ * 0.0;
        auVar205._20_4_ = auVar170._20_4_ * auVar170._20_4_ * 0.0;
        auVar205._24_4_ = auVar170._24_4_ * auVar170._24_4_ * 0.0;
        auVar205._28_4_ = 0;
        auVar45._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar45._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar45._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar45._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar45._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar45._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar45._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar45._28_4_ = auVar100._28_4_;
        auVar170 = vcmpps_avx(auVar45,auVar205,2);
        local_360 = (int)lVar87;
        auVar206._4_4_ = local_360;
        auVar206._0_4_ = local_360;
        auVar206._8_4_ = local_360;
        auVar206._12_4_ = local_360;
        auVar206._16_4_ = local_360;
        auVar206._20_4_ = local_360;
        auVar206._24_4_ = local_360;
        auVar206._28_4_ = local_360;
        auVar100 = vpor_avx2(auVar206,_DAT_01fb4ba0);
        auVar17 = vpcmpgtd_avx2(local_440,auVar100);
        auVar100 = auVar17 & auVar170;
        fVar138 = (float)local_720;
        fVar110 = local_720._4_4_;
        fVar111 = (float)uStack_718;
        fVar112 = uStack_718._4_4_;
        fVar114 = (float)uStack_710;
        fVar115 = uStack_710._4_4_;
        fVar116 = (float)uStack_708;
        uVar224 = uStack_708._4_4_;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) {
          auVar137 = ZEXT3264(local_780);
          auVar223 = ZEXT3264(auVar222);
          auVar208 = ZEXT3264(auVar208._0_32_);
        }
        else {
          local_460 = vandps_avx(auVar17,auVar170);
          auVar46._4_4_ = (float)local_7e0._4_4_ * fVar193;
          auVar46._0_4_ = (float)local_7e0._0_4_ * fVar188;
          auVar46._8_4_ = fStack_7d8 * fVar195;
          auVar46._12_4_ = fStack_7d4 * fVar197;
          auVar46._16_4_ = fStack_7d0 * fVar199;
          auVar46._20_4_ = fStack_7cc * fVar200;
          auVar46._24_4_ = fStack_7c8 * fVar201;
          auVar46._28_4_ = auVar170._28_4_;
          auVar160 = vfmadd213ps_fma(auVar99,local_740,auVar46);
          auVar160 = vfmadd213ps_fma(auVar107,local_240,ZEXT1632(auVar160));
          auVar160 = vfmadd132ps_fma(auVar106,ZEXT1632(auVar160),local_760);
          _local_480 = ZEXT1632(auVar160);
          local_5a0._0_4_ = auVar79._0_4_;
          local_5a0._4_4_ = auVar79._4_4_;
          fStack_598 = auVar79._8_4_;
          fStack_594 = auVar79._12_4_;
          fStack_590 = auVar79._16_4_;
          fStack_58c = auVar79._20_4_;
          fStack_588 = auVar79._24_4_;
          auVar47._4_4_ = (float)local_7e0._4_4_ * (float)local_5a0._4_4_;
          auVar47._0_4_ = (float)local_7e0._0_4_ * (float)local_5a0._0_4_;
          auVar47._8_4_ = fStack_7d8 * fStack_598;
          auVar47._12_4_ = fStack_7d4 * fStack_594;
          auVar47._16_4_ = fStack_7d0 * fStack_590;
          auVar47._20_4_ = fStack_7cc * fStack_58c;
          auVar47._24_4_ = fStack_7c8 * fStack_588;
          auVar47._28_4_ = auVar170._28_4_;
          auVar160 = vfmadd213ps_fma(auVar174,local_740,auVar47);
          auVar160 = vfmadd213ps_fma(auVar121,local_240,ZEXT1632(auVar160));
          auVar121 = *(undefined1 (*) [32])(lVar86 + 0x2200d38 + lVar87 * 4);
          auVar174 = *(undefined1 (*) [32])(lVar86 + 0x22011bc + lVar87 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar86 + 0x2201640 + lVar87 * 4);
          pfVar3 = (float *)(lVar86 + 0x2201ac4 + lVar87 * 4);
          fVar117 = *pfVar3;
          fVar194 = pfVar3[1];
          fVar196 = pfVar3[2];
          fVar198 = pfVar3[3];
          fVar213 = pfVar3[4];
          fVar215 = pfVar3[5];
          fVar217 = pfVar3[6];
          auVar48._4_4_ = fVar209 * fVar194;
          auVar48._0_4_ = fVar202 * fVar117;
          auVar48._8_4_ = fVar210 * fVar196;
          auVar48._12_4_ = fVar211 * fVar198;
          auVar48._16_4_ = fVar212 * fVar213;
          auVar48._20_4_ = fVar214 * fVar215;
          auVar48._24_4_ = fVar216 * fVar217;
          auVar48._28_4_ = uStack_7c4;
          auVar227._0_4_ = fVar117 * (float)local_720;
          auVar227._4_4_ = fVar194 * local_720._4_4_;
          auVar227._8_4_ = fVar196 * (float)uStack_718;
          auVar227._12_4_ = fVar198 * uStack_718._4_4_;
          auVar227._16_4_ = fVar213 * (float)uStack_710;
          auVar227._20_4_ = fVar215 * uStack_710._4_4_;
          auVar227._24_4_ = fVar217 * (float)uStack_708;
          auVar227._28_4_ = 0;
          auVar49._4_4_ = fVar194 * (float)local_7e0._4_4_;
          auVar49._0_4_ = fVar117 * (float)local_7e0._0_4_;
          auVar49._8_4_ = fVar196 * fStack_7d8;
          auVar49._12_4_ = fVar198 * fStack_7d4;
          auVar49._16_4_ = fVar213 * fStack_7d0;
          auVar49._20_4_ = fVar215 * fStack_7cc;
          auVar49._24_4_ = fVar217 * fStack_7c8;
          auVar49._28_4_ = pfVar3[7];
          auVar165 = vfmadd231ps_fma(auVar48,auVar106,local_6e0);
          auVar94 = vfmadd231ps_fma(auVar227,auVar106,auVar222);
          auVar93 = vfmadd231ps_fma(auVar49,local_740,auVar106);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar174,auVar190);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar174,local_580);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_240,auVar174);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar121,auVar152);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar121,local_600);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_760,auVar121);
          pfVar3 = (float *)(lVar86 + 0x2203ee4 + lVar87 * 4);
          fVar117 = *pfVar3;
          fVar194 = pfVar3[1];
          fVar196 = pfVar3[2];
          fVar198 = pfVar3[3];
          fVar213 = pfVar3[4];
          fVar215 = pfVar3[5];
          fVar217 = pfVar3[6];
          auVar50._4_4_ = fVar209 * fVar194;
          auVar50._0_4_ = fVar202 * fVar117;
          auVar50._8_4_ = fVar210 * fVar196;
          auVar50._12_4_ = fVar211 * fVar198;
          auVar50._16_4_ = fVar212 * fVar213;
          auVar50._20_4_ = fVar214 * fVar215;
          auVar50._24_4_ = fVar216 * fVar217;
          auVar50._28_4_ = auVar223._28_4_;
          auVar51._4_4_ = local_720._4_4_ * fVar194;
          auVar51._0_4_ = (float)local_720 * fVar117;
          auVar51._8_4_ = (float)uStack_718 * fVar196;
          auVar51._12_4_ = uStack_718._4_4_ * fVar198;
          auVar51._16_4_ = (float)uStack_710 * fVar213;
          auVar51._20_4_ = uStack_710._4_4_ * fVar215;
          auVar51._24_4_ = (float)uStack_708 * fVar217;
          auVar51._28_4_ = local_420._28_4_;
          auVar52._4_4_ = fVar194 * (float)local_7e0._4_4_;
          auVar52._0_4_ = fVar117 * (float)local_7e0._0_4_;
          auVar52._8_4_ = fVar196 * fStack_7d8;
          auVar52._12_4_ = fVar198 * fStack_7d4;
          auVar52._16_4_ = fVar213 * fStack_7d0;
          auVar52._20_4_ = fVar215 * fStack_7cc;
          auVar52._24_4_ = fVar217 * fStack_7c8;
          auVar52._28_4_ = pfVar3[7];
          auVar121 = *(undefined1 (*) [32])(lVar86 + 0x2203a60 + lVar87 * 4);
          auVar119 = vfmadd231ps_fma(auVar50,auVar121,local_6e0);
          auVar139 = vfmadd231ps_fma(auVar51,auVar121,auVar222);
          auVar92 = vfmadd231ps_fma(auVar52,auVar121,local_740);
          auVar121 = *(undefined1 (*) [32])(lVar86 + 0x22035dc + lVar87 * 4);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,auVar190);
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,local_580);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar121,local_240);
          auVar121 = *(undefined1 (*) [32])(lVar86 + 0x2203158 + lVar87 * 4);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar121,auVar152);
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar121,local_600);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_760,auVar121);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar207._16_4_ = 0x7fffffff;
          auVar207._20_4_ = 0x7fffffff;
          auVar207._24_4_ = 0x7fffffff;
          auVar207._28_4_ = 0x7fffffff;
          auVar121 = vandps_avx(ZEXT1632(auVar165),auVar207);
          auVar174 = vandps_avx(ZEXT1632(auVar94),auVar207);
          auVar174 = vmaxps_avx(auVar121,auVar174);
          auVar121 = vandps_avx(ZEXT1632(auVar93),auVar207);
          auVar121 = vmaxps_avx(auVar174,auVar121);
          auVar121 = vcmpps_avx(auVar121,_local_4a0,1);
          auVar106 = vblendvps_avx(ZEXT1632(auVar165),local_400,auVar121);
          auVar107 = vblendvps_avx(ZEXT1632(auVar94),local_420,auVar121);
          auVar121 = vandps_avx(ZEXT1632(auVar119),auVar207);
          auVar174 = vandps_avx(ZEXT1632(auVar139),auVar207);
          auVar174 = vmaxps_avx(auVar121,auVar174);
          auVar121 = vandps_avx(auVar207,ZEXT1632(auVar92));
          auVar121 = vmaxps_avx(auVar174,auVar121);
          auVar174 = vcmpps_avx(auVar121,_local_4a0,1);
          auVar121 = vblendvps_avx(ZEXT1632(auVar119),local_400,auVar174);
          auVar174 = vblendvps_avx(ZEXT1632(auVar139),local_420,auVar174);
          auVar160 = vfmadd213ps_fma(auVar98,local_760,ZEXT1632(auVar160));
          auVar165 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar107,auVar107);
          auVar98 = vrsqrtps_avx(ZEXT1632(auVar165));
          fVar117 = auVar98._0_4_;
          fVar194 = auVar98._4_4_;
          fVar196 = auVar98._8_4_;
          fVar198 = auVar98._12_4_;
          fVar213 = auVar98._16_4_;
          fVar215 = auVar98._20_4_;
          fVar217 = auVar98._24_4_;
          auVar53._4_4_ = fVar194 * fVar194 * fVar194 * auVar165._4_4_ * -0.5;
          auVar53._0_4_ = fVar117 * fVar117 * fVar117 * auVar165._0_4_ * -0.5;
          auVar53._8_4_ = fVar196 * fVar196 * fVar196 * auVar165._8_4_ * -0.5;
          auVar53._12_4_ = fVar198 * fVar198 * fVar198 * auVar165._12_4_ * -0.5;
          auVar53._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar53._20_4_ = fVar215 * fVar215 * fVar215 * -0.0;
          auVar53._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
          auVar53._28_4_ = 0;
          auVar235._8_4_ = 0x3fc00000;
          auVar235._0_8_ = 0x3fc000003fc00000;
          auVar235._12_4_ = 0x3fc00000;
          auVar235._16_4_ = 0x3fc00000;
          auVar235._20_4_ = 0x3fc00000;
          auVar235._24_4_ = 0x3fc00000;
          auVar235._28_4_ = 0x3fc00000;
          auVar165 = vfmadd231ps_fma(auVar53,auVar235,auVar98);
          fVar117 = auVar165._0_4_;
          fVar194 = auVar165._4_4_;
          auVar54._4_4_ = auVar107._4_4_ * fVar194;
          auVar54._0_4_ = auVar107._0_4_ * fVar117;
          fVar196 = auVar165._8_4_;
          auVar54._8_4_ = auVar107._8_4_ * fVar196;
          fVar198 = auVar165._12_4_;
          auVar54._12_4_ = auVar107._12_4_ * fVar198;
          auVar54._16_4_ = auVar107._16_4_ * 0.0;
          auVar54._20_4_ = auVar107._20_4_ * 0.0;
          auVar54._24_4_ = auVar107._24_4_ * 0.0;
          auVar54._28_4_ = auVar98._28_4_;
          auVar55._4_4_ = fVar194 * -auVar106._4_4_;
          auVar55._0_4_ = fVar117 * -auVar106._0_4_;
          auVar55._8_4_ = fVar196 * -auVar106._8_4_;
          auVar55._12_4_ = fVar198 * -auVar106._12_4_;
          auVar55._16_4_ = -auVar106._16_4_ * 0.0;
          auVar55._20_4_ = -auVar106._20_4_ * 0.0;
          auVar55._24_4_ = -auVar106._24_4_ * 0.0;
          auVar55._28_4_ = auVar107._28_4_;
          auVar165 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar174,auVar174);
          auVar98 = vrsqrtps_avx(ZEXT1632(auVar165));
          auVar56._28_4_ = local_400._28_4_;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(fVar198 * 0.0,
                                  CONCAT48(fVar196 * 0.0,CONCAT44(fVar194 * 0.0,fVar117 * 0.0))));
          fVar117 = auVar98._0_4_;
          fVar194 = auVar98._4_4_;
          fVar196 = auVar98._8_4_;
          fVar198 = auVar98._12_4_;
          fVar213 = auVar98._16_4_;
          fVar215 = auVar98._20_4_;
          fVar217 = auVar98._24_4_;
          auVar57._4_4_ = fVar194 * fVar194 * fVar194 * auVar165._4_4_ * -0.5;
          auVar57._0_4_ = fVar117 * fVar117 * fVar117 * auVar165._0_4_ * -0.5;
          auVar57._8_4_ = fVar196 * fVar196 * fVar196 * auVar165._8_4_ * -0.5;
          auVar57._12_4_ = fVar198 * fVar198 * fVar198 * auVar165._12_4_ * -0.5;
          auVar57._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar57._20_4_ = fVar215 * fVar215 * fVar215 * -0.0;
          auVar57._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
          auVar57._28_4_ = 0;
          auVar165 = vfmadd231ps_fma(auVar57,auVar235,auVar98);
          fVar117 = auVar165._0_4_;
          fVar194 = auVar165._4_4_;
          auVar58._4_4_ = auVar174._4_4_ * fVar194;
          auVar58._0_4_ = auVar174._0_4_ * fVar117;
          fVar196 = auVar165._8_4_;
          auVar58._8_4_ = auVar174._8_4_ * fVar196;
          fVar198 = auVar165._12_4_;
          auVar58._12_4_ = auVar174._12_4_ * fVar198;
          auVar58._16_4_ = auVar174._16_4_ * 0.0;
          auVar58._20_4_ = auVar174._20_4_ * 0.0;
          auVar58._24_4_ = auVar174._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = fVar194 * -auVar121._4_4_;
          auVar59._0_4_ = fVar117 * -auVar121._0_4_;
          auVar59._8_4_ = fVar196 * -auVar121._8_4_;
          auVar59._12_4_ = fVar198 * -auVar121._12_4_;
          auVar59._16_4_ = -auVar121._16_4_ * 0.0;
          auVar59._20_4_ = -auVar121._20_4_ * 0.0;
          auVar59._24_4_ = -auVar121._24_4_ * 0.0;
          auVar59._28_4_ = auVar98._28_4_;
          auVar60._28_4_ = 0xbf000000;
          auVar60._0_28_ =
               ZEXT1628(CONCAT412(fVar198 * 0.0,
                                  CONCAT48(fVar196 * 0.0,CONCAT44(fVar194 * 0.0,fVar117 * 0.0))));
          auVar165 = vfmadd213ps_fma(auVar54,local_520,local_700);
          auVar94 = vfmadd213ps_fma(auVar55,local_520,local_640);
          auVar93 = vfmadd213ps_fma(auVar56,local_520,ZEXT1632(auVar160));
          auVar151 = vfnmadd213ps_fma(auVar54,local_520,local_700);
          auVar119 = vfmadd213ps_fma(auVar58,auVar101,auVar182);
          auVar156 = vfnmadd213ps_fma(auVar55,local_520,local_640);
          auVar139 = vfmadd213ps_fma(auVar59,auVar101,auVar129);
          auVar160 = vfnmadd231ps_fma(ZEXT1632(auVar160),local_520,auVar56);
          auVar92 = vfmadd213ps_fma(auVar60,auVar101,_local_480);
          auVar91 = vfnmadd213ps_fma(auVar58,auVar101,auVar182);
          auVar118 = vfnmadd213ps_fma(auVar59,auVar101,auVar129);
          auVar169 = vfnmadd231ps_fma(_local_480,auVar101,auVar60);
          auVar98 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar156));
          auVar121 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar160));
          auVar61._4_4_ = auVar98._4_4_ * auVar160._4_4_;
          auVar61._0_4_ = auVar98._0_4_ * auVar160._0_4_;
          auVar61._8_4_ = auVar98._8_4_ * auVar160._8_4_;
          auVar61._12_4_ = auVar98._12_4_ * auVar160._12_4_;
          auVar61._16_4_ = auVar98._16_4_ * 0.0;
          auVar61._20_4_ = auVar98._20_4_ * 0.0;
          auVar61._24_4_ = auVar98._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar120 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar156),auVar121);
          auVar62._4_4_ = auVar151._4_4_ * auVar121._4_4_;
          auVar62._0_4_ = auVar151._0_4_ * auVar121._0_4_;
          auVar62._8_4_ = auVar151._8_4_ * auVar121._8_4_;
          auVar62._12_4_ = auVar151._12_4_ * auVar121._12_4_;
          auVar62._16_4_ = auVar121._16_4_ * 0.0;
          auVar62._20_4_ = auVar121._20_4_ * 0.0;
          auVar62._24_4_ = auVar121._24_4_ * 0.0;
          auVar62._28_4_ = auVar121._28_4_;
          auVar99 = ZEXT1632(auVar151);
          auVar121 = vsubps_avx(ZEXT1632(auVar119),auVar99);
          auVar100 = ZEXT1632(auVar160);
          auVar160 = vfmsub231ps_fma(auVar62,auVar100,auVar121);
          auVar63._4_4_ = auVar156._4_4_ * auVar121._4_4_;
          auVar63._0_4_ = auVar156._0_4_ * auVar121._0_4_;
          auVar63._8_4_ = auVar156._8_4_ * auVar121._8_4_;
          auVar63._12_4_ = auVar156._12_4_ * auVar121._12_4_;
          auVar63._16_4_ = auVar121._16_4_ * 0.0;
          auVar63._20_4_ = auVar121._20_4_ * 0.0;
          auVar63._24_4_ = auVar121._24_4_ * 0.0;
          auVar63._28_4_ = auVar121._28_4_;
          auVar151 = vfmsub231ps_fma(auVar63,auVar99,auVar98);
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar151),ZEXT832(0) << 0x20,ZEXT1632(auVar160));
          auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),ZEXT832(0) << 0x20,ZEXT1632(auVar120));
          auVar17 = vcmpps_avx(ZEXT1632(auVar160),ZEXT832(0) << 0x20,2);
          auVar98 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar165),auVar17);
          auVar121 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar94),auVar17);
          local_7c0 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar93),auVar17);
          auVar174 = vblendvps_avx(auVar99,ZEXT1632(auVar119),auVar17);
          auVar106 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar139),auVar17);
          auVar107 = vblendvps_avx(auVar100,ZEXT1632(auVar92),auVar17);
          auVar99 = vblendvps_avx(ZEXT1632(auVar119),auVar99,auVar17);
          auVar170 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar156),auVar17);
          auVar160 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
          auVar100 = vblendvps_avx(ZEXT1632(auVar92),auVar100,auVar17);
          auVar99 = vsubps_avx(auVar99,auVar98);
          auVar170 = vsubps_avx(auVar170,auVar121);
          auVar129 = vsubps_avx(auVar100,local_7c0);
          auVar229 = ZEXT3264(auVar129);
          auVar182 = vsubps_avx(auVar98,auVar174);
          auVar222 = vsubps_avx(auVar121,auVar106);
          auVar122 = vsubps_avx(local_7c0,auVar107);
          auVar231 = ZEXT3264(auVar122);
          auVar171._0_4_ = auVar129._0_4_ * auVar98._0_4_;
          auVar171._4_4_ = auVar129._4_4_ * auVar98._4_4_;
          auVar171._8_4_ = auVar129._8_4_ * auVar98._8_4_;
          auVar171._12_4_ = auVar129._12_4_ * auVar98._12_4_;
          auVar171._16_4_ = auVar129._16_4_ * auVar98._16_4_;
          auVar171._20_4_ = auVar129._20_4_ * auVar98._20_4_;
          auVar171._24_4_ = auVar129._24_4_ * auVar98._24_4_;
          auVar171._28_4_ = 0;
          auVar165 = vfmsub231ps_fma(auVar171,local_7c0,auVar99);
          auVar64._4_4_ = auVar99._4_4_ * auVar121._4_4_;
          auVar64._0_4_ = auVar99._0_4_ * auVar121._0_4_;
          auVar64._8_4_ = auVar99._8_4_ * auVar121._8_4_;
          auVar64._12_4_ = auVar99._12_4_ * auVar121._12_4_;
          auVar64._16_4_ = auVar99._16_4_ * auVar121._16_4_;
          auVar64._20_4_ = auVar99._20_4_ * auVar121._20_4_;
          auVar64._24_4_ = auVar99._24_4_ * auVar121._24_4_;
          auVar64._28_4_ = auVar100._28_4_;
          auVar94 = vfmsub231ps_fma(auVar64,auVar98,auVar170);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
          auVar172._0_4_ = auVar170._0_4_ * local_7c0._0_4_;
          auVar172._4_4_ = auVar170._4_4_ * local_7c0._4_4_;
          auVar172._8_4_ = auVar170._8_4_ * local_7c0._8_4_;
          auVar172._12_4_ = auVar170._12_4_ * local_7c0._12_4_;
          auVar172._16_4_ = auVar170._16_4_ * local_7c0._16_4_;
          auVar172._20_4_ = auVar170._20_4_ * local_7c0._20_4_;
          auVar172._24_4_ = auVar170._24_4_ * local_7c0._24_4_;
          auVar172._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar172,auVar121,auVar129);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar94));
          auVar173._0_4_ = auVar122._0_4_ * auVar174._0_4_;
          auVar173._4_4_ = auVar122._4_4_ * auVar174._4_4_;
          auVar173._8_4_ = auVar122._8_4_ * auVar174._8_4_;
          auVar173._12_4_ = auVar122._12_4_ * auVar174._12_4_;
          auVar173._16_4_ = auVar122._16_4_ * auVar174._16_4_;
          auVar173._20_4_ = auVar122._20_4_ * auVar174._20_4_;
          auVar173._24_4_ = auVar122._24_4_ * auVar174._24_4_;
          auVar173._28_4_ = 0;
          auVar165 = vfmsub231ps_fma(auVar173,auVar182,auVar107);
          auVar65._4_4_ = auVar222._4_4_ * auVar107._4_4_;
          auVar65._0_4_ = auVar222._0_4_ * auVar107._0_4_;
          auVar65._8_4_ = auVar222._8_4_ * auVar107._8_4_;
          auVar65._12_4_ = auVar222._12_4_ * auVar107._12_4_;
          auVar65._16_4_ = auVar222._16_4_ * auVar107._16_4_;
          auVar65._20_4_ = auVar222._20_4_ * auVar107._20_4_;
          auVar65._24_4_ = auVar222._24_4_ * auVar107._24_4_;
          auVar65._28_4_ = auVar98._28_4_;
          auVar93 = vfmsub231ps_fma(auVar65,auVar106,auVar122);
          auVar66._4_4_ = auVar182._4_4_ * auVar106._4_4_;
          auVar66._0_4_ = auVar182._0_4_ * auVar106._0_4_;
          auVar66._8_4_ = auVar182._8_4_ * auVar106._8_4_;
          auVar66._12_4_ = auVar182._12_4_ * auVar106._12_4_;
          auVar66._16_4_ = auVar182._16_4_ * auVar106._16_4_;
          auVar66._20_4_ = auVar182._20_4_ * auVar106._20_4_;
          auVar66._24_4_ = auVar182._24_4_ * auVar106._24_4_;
          auVar66._28_4_ = auVar106._28_4_;
          auVar119 = vfmsub231ps_fma(auVar66,auVar222,auVar174);
          auVar107 = ZEXT832(0) << 0x20;
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar107,ZEXT1632(auVar165));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar107,ZEXT1632(auVar93));
          auVar174 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar174 = vcmpps_avx(auVar174,auVar107,2);
          auVar165 = vpackssdw_avx(auVar174._0_16_,auVar174._16_16_);
          auVar160 = vpand_avx(auVar165,auVar160);
          auVar174 = vpmovsxwd_avx2(auVar160);
          auVar106 = local_7c0;
          if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar174 >> 0x7f,0) == '\0') &&
                (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar174 >> 0xbf,0) == '\0') &&
              (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar174[0x1f]) {
LAB_0112a9fd:
            auVar192 = auVar106;
            auVar154._8_8_ = local_6a0[1]._8_8_;
            auVar154._0_8_ = local_6a0[1]._0_8_;
            auVar154._16_8_ = local_6a0[1]._16_8_;
            auVar154._24_8_ = local_6a0[1]._24_8_;
          }
          else {
            auVar67._4_4_ = auVar170._4_4_ * auVar122._4_4_;
            auVar67._0_4_ = auVar170._0_4_ * auVar122._0_4_;
            auVar67._8_4_ = auVar170._8_4_ * auVar122._8_4_;
            auVar67._12_4_ = auVar170._12_4_ * auVar122._12_4_;
            auVar67._16_4_ = auVar170._16_4_ * auVar122._16_4_;
            auVar67._20_4_ = auVar170._20_4_ * auVar122._20_4_;
            auVar67._24_4_ = auVar170._24_4_ * auVar122._24_4_;
            auVar67._28_4_ = auVar174._28_4_;
            auVar92 = vfmsub231ps_fma(auVar67,auVar222,auVar129);
            auVar183._0_4_ = auVar129._0_4_ * auVar182._0_4_;
            auVar183._4_4_ = auVar129._4_4_ * auVar182._4_4_;
            auVar183._8_4_ = auVar129._8_4_ * auVar182._8_4_;
            auVar183._12_4_ = auVar129._12_4_ * auVar182._12_4_;
            auVar183._16_4_ = auVar129._16_4_ * auVar182._16_4_;
            auVar183._20_4_ = auVar129._20_4_ * auVar182._20_4_;
            auVar183._24_4_ = auVar129._24_4_ * auVar182._24_4_;
            auVar183._28_4_ = 0;
            auVar120 = vfmsub231ps_fma(auVar183,auVar99,auVar122);
            auVar68._4_4_ = auVar99._4_4_ * auVar222._4_4_;
            auVar68._0_4_ = auVar99._0_4_ * auVar222._0_4_;
            auVar68._8_4_ = auVar99._8_4_ * auVar222._8_4_;
            auVar68._12_4_ = auVar99._12_4_ * auVar222._12_4_;
            auVar68._16_4_ = auVar99._16_4_ * auVar222._16_4_;
            auVar68._20_4_ = auVar99._20_4_ * auVar222._20_4_;
            auVar68._24_4_ = auVar99._24_4_ * auVar222._24_4_;
            auVar68._28_4_ = auVar222._28_4_;
            auVar151 = vfmsub231ps_fma(auVar68,auVar182,auVar170);
            auVar165 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar120),ZEXT1632(auVar151));
            auVar139 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT1632(auVar92),auVar107);
            auVar174 = vrcpps_avx(ZEXT1632(auVar139));
            auVar228._8_4_ = 0x3f800000;
            auVar228._0_8_ = 0x3f8000003f800000;
            auVar228._12_4_ = 0x3f800000;
            auVar228._16_4_ = 0x3f800000;
            auVar228._20_4_ = 0x3f800000;
            auVar228._24_4_ = 0x3f800000;
            auVar228._28_4_ = 0x3f800000;
            auVar229 = ZEXT3264(auVar228);
            auVar165 = vfnmadd213ps_fma(auVar174,ZEXT1632(auVar139),auVar228);
            auVar119 = vfmadd132ps_fma(ZEXT1632(auVar165),auVar174,auVar174);
            auVar192 = ZEXT1632(auVar119);
            auVar69._4_4_ = auVar151._4_4_ * local_7c0._4_4_;
            auVar69._0_4_ = auVar151._0_4_ * local_7c0._0_4_;
            auVar69._8_4_ = auVar151._8_4_ * local_7c0._8_4_;
            auVar69._12_4_ = auVar151._12_4_ * local_7c0._12_4_;
            auVar69._16_4_ = local_7c0._16_4_ * 0.0;
            auVar69._20_4_ = local_7c0._20_4_ * 0.0;
            auVar69._24_4_ = local_7c0._24_4_ * 0.0;
            auVar69._28_4_ = auVar121._28_4_;
            auVar165 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar120),auVar121);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT1632(auVar92),auVar98);
            fVar117 = auVar119._0_4_;
            fVar194 = auVar119._4_4_;
            fVar196 = auVar119._8_4_;
            fVar198 = auVar119._12_4_;
            auVar174 = ZEXT1632(CONCAT412(fVar198 * auVar165._12_4_,
                                          CONCAT48(fVar196 * auVar165._8_4_,
                                                   CONCAT44(fVar194 * auVar165._4_4_,
                                                            fVar117 * auVar165._0_4_))));
            uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar153._4_4_ = uVar88;
            auVar153._0_4_ = uVar88;
            auVar153._8_4_ = uVar88;
            auVar153._12_4_ = uVar88;
            auVar153._16_4_ = uVar88;
            auVar153._20_4_ = uVar88;
            auVar153._24_4_ = uVar88;
            auVar153._28_4_ = uVar88;
            auVar78._4_4_ = uStack_65c;
            auVar78._0_4_ = local_660;
            auVar78._8_4_ = uStack_658;
            auVar78._12_4_ = uStack_654;
            auVar78._16_4_ = uStack_650;
            auVar78._20_4_ = uStack_64c;
            auVar78._24_4_ = uStack_648;
            auVar78._28_4_ = uStack_644;
            auVar98 = vcmpps_avx(auVar78,auVar174,2);
            auVar121 = vcmpps_avx(auVar174,auVar153,2);
            auVar98 = vandps_avx(auVar121,auVar98);
            auVar165 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar160 = vpand_avx(auVar160,auVar165);
            auVar98 = vpmovsxwd_avx2(auVar160);
            auVar106 = ZEXT1632(auVar119);
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0x7f,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0xbf,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar98[0x1f]) goto LAB_0112a9fd;
            auVar98 = vcmpps_avx(ZEXT1632(auVar139),ZEXT832(0) << 0x20,4);
            auVar165 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar160 = vpand_avx(auVar160,auVar165);
            auVar98 = vpmovsxwd_avx2(auVar160);
            auVar154._8_8_ = local_6a0[1]._8_8_;
            auVar154._0_8_ = local_6a0[1]._0_8_;
            auVar154._16_8_ = local_6a0[1]._16_8_;
            auVar154._24_8_ = local_6a0[1]._24_8_;
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0x7f,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0xbf,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar98[0x1f] < '\0') {
              auVar106 = ZEXT1632(CONCAT412(fVar198 * auVar94._12_4_,
                                            CONCAT48(fVar196 * auVar94._8_4_,
                                                     CONCAT44(fVar194 * auVar94._4_4_,
                                                              fVar117 * auVar94._0_4_))));
              auVar70._28_4_ = SUB84(local_6a0[1]._24_8_,4);
              auVar70._0_28_ =
                   ZEXT1628(CONCAT412(fVar198 * auVar93._12_4_,
                                      CONCAT48(fVar196 * auVar93._8_4_,
                                               CONCAT44(fVar194 * auVar93._4_4_,
                                                        fVar117 * auVar93._0_4_))));
              auVar192._8_4_ = 0x3f800000;
              auVar192._0_8_ = 0x3f8000003f800000;
              auVar192._12_4_ = 0x3f800000;
              auVar192._16_4_ = 0x3f800000;
              auVar192._20_4_ = 0x3f800000;
              auVar192._24_4_ = 0x3f800000;
              auVar192._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar192,auVar106);
              local_780 = vblendvps_avx(auVar121,auVar106,auVar17);
              auVar121 = vsubps_avx(auVar192,auVar70);
              local_4e0 = vblendvps_avx(auVar121,auVar70,auVar17);
              auVar154 = auVar98;
              local_5e0 = auVar174;
            }
          }
          auVar223 = ZEXT3264(local_620);
          auVar208 = ZEXT3264(CONCAT428(fStack_4e4,
                                        CONCAT424(fStack_4e8,
                                                  CONCAT420(fStack_4ec,
                                                            CONCAT416(fStack_4f0,
                                                                      CONCAT412(fStack_4f4,
                                                                                CONCAT48(fStack_4f8,
                                                                                         CONCAT44(
                                                  fStack_4fc,local_500))))))));
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar154 >> 0x7f,0) != '\0') ||
                (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar154 >> 0xbf,0) != '\0') ||
              (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar154[0x1f] < '\0') {
            auVar98 = vsubps_avx(auVar101,local_520);
            auVar160 = vfmadd213ps_fma(auVar98,local_780,local_520);
            fVar117 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar71._4_4_ = (auVar160._4_4_ + auVar160._4_4_) * fVar117;
            auVar71._0_4_ = (auVar160._0_4_ + auVar160._0_4_) * fVar117;
            auVar71._8_4_ = (auVar160._8_4_ + auVar160._8_4_) * fVar117;
            auVar71._12_4_ = (auVar160._12_4_ + auVar160._12_4_) * fVar117;
            auVar71._16_4_ = fVar117 * 0.0;
            auVar71._20_4_ = fVar117 * 0.0;
            auVar71._24_4_ = fVar117 * 0.0;
            auVar71._28_4_ = fVar117;
            auVar98 = vcmpps_avx(local_5e0,auVar71,6);
            auVar121 = auVar154 & auVar98;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar150._8_4_ = 0x40000000;
              auVar150._0_8_ = 0x4000000040000000;
              auVar150._12_4_ = 0x40000000;
              auVar150._16_4_ = 0x40000000;
              auVar150._20_4_ = 0x40000000;
              auVar150._24_4_ = 0x40000000;
              auVar150._28_4_ = 0x40000000;
              auVar160 = vfmadd213ps_fma(local_4e0,auVar150,auVar131);
              local_3c0 = local_780;
              local_3a0 = ZEXT1632(auVar160);
              local_380 = local_5e0;
              local_340 = local_870;
              uStack_338 = uStack_868;
              local_330 = local_880;
              uStack_328 = uStack_878;
              local_320 = local_890;
              uStack_318 = uStack_888;
              pGVar9 = (context->scene->geometries).items[uVar7].ptr;
              auVar137 = ZEXT3264(local_780);
              local_4e0 = local_3a0;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_6c0 = vandps_avx(auVar98,auVar154);
                fVar138 = (float)local_360;
                local_2e0[0] = (fVar138 + local_780._0_4_ + 0.0) * local_100;
                local_2e0[1] = (fVar138 + local_780._4_4_ + 1.0) * fStack_fc;
                local_2e0[2] = (fVar138 + local_780._8_4_ + 2.0) * fStack_f8;
                local_2e0[3] = (fVar138 + local_780._12_4_ + 3.0) * fStack_f4;
                fStack_2d0 = (fVar138 + local_780._16_4_ + 4.0) * fStack_f0;
                fStack_2cc = (fVar138 + local_780._20_4_ + 5.0) * fStack_ec;
                fStack_2c8 = (fVar138 + local_780._24_4_ + 6.0) * fStack_e8;
                fStack_2c4 = fVar138 + local_780._28_4_ + 7.0;
                local_4e0._0_8_ = auVar160._0_8_;
                local_4e0._8_8_ = auVar160._8_8_;
                local_2c0 = local_4e0._0_8_;
                uStack_2b8 = local_4e0._8_8_;
                uStack_2b0 = 0;
                uStack_2a8 = 0;
                local_2a0 = local_5e0;
                auVar132._8_4_ = 0x7f800000;
                auVar132._0_8_ = 0x7f8000007f800000;
                auVar132._12_4_ = 0x7f800000;
                auVar132._16_4_ = 0x7f800000;
                auVar132._20_4_ = 0x7f800000;
                auVar132._24_4_ = 0x7f800000;
                auVar132._28_4_ = 0x7f800000;
                auVar98 = vblendvps_avx(auVar132,local_5e0,local_6c0);
                auVar121 = vshufps_avx(auVar98,auVar98,0xb1);
                auVar121 = vminps_avx(auVar98,auVar121);
                auVar174 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar174);
                auVar174 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar174);
                auVar121 = vcmpps_avx(auVar98,auVar121,0);
                auVar174 = local_6c0 & auVar121;
                auVar98 = local_6c0;
                if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar174 >> 0x7f,0) != '\0') ||
                      (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar174 >> 0xbf,0) != '\0') ||
                    (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar174[0x1f] < '\0') {
                  auVar98 = vandps_avx(auVar121,local_6c0);
                }
                uVar82 = vmovmskps_avx(auVar98);
                uVar18 = 0;
                for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                  uVar18 = uVar18 + 1;
                }
                uVar84 = (ulong)uVar18;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar138 = local_2e0[uVar84];
                  uVar88 = *(undefined4 *)((long)&local_2c0 + uVar84 * 4);
                  fVar110 = 1.0 - fVar138;
                  auVar160 = ZEXT416((uint)(fVar138 * fVar110 * 4.0));
                  auVar165 = vfnmsub213ss_fma(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),auVar160
                                             );
                  auVar160 = vfmadd213ss_fma(ZEXT416((uint)fVar110),ZEXT416((uint)fVar110),auVar160)
                  ;
                  fVar110 = fVar110 * -fVar110 * 0.5;
                  fVar111 = auVar165._0_4_ * 0.5;
                  fVar112 = auVar160._0_4_ * 0.5;
                  fVar114 = fVar138 * fVar138 * 0.5;
                  auVar161._0_4_ = fVar114 * fVar113;
                  auVar161._4_4_ = fVar114 * fVar73;
                  auVar161._8_4_ = fVar114 * fVar74;
                  auVar161._12_4_ = fVar114 * fVar75;
                  auVar142._4_4_ = fVar112;
                  auVar142._0_4_ = fVar112;
                  auVar142._8_4_ = fVar112;
                  auVar142._12_4_ = fVar112;
                  auVar160 = vfmadd132ps_fma(auVar142,auVar161,auVar15);
                  auVar162._4_4_ = fVar111;
                  auVar162._0_4_ = fVar111;
                  auVar162._8_4_ = fVar111;
                  auVar162._12_4_ = fVar111;
                  auVar160 = vfmadd132ps_fma(auVar162,auVar160,auVar14);
                  auVar143._4_4_ = fVar110;
                  auVar143._0_4_ = fVar110;
                  auVar143._8_4_ = fVar110;
                  auVar143._12_4_ = fVar110;
                  auVar160 = vfmadd132ps_fma(auVar143,auVar160,auVar12);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar84 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar160._0_4_;
                  uVar224 = vextractps_avx(auVar160,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar224;
                  uVar224 = vextractps_avx(auVar160,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar224;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar138;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar88;
                  *(uint *)(ray + k * 4 + 0x220) = uVar81;
                  *(uint *)(ray + k * 4 + 0x240) = uVar7;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar137 = ZEXT864(0) << 0x20;
                  auVar98 = vpcmpeqd_avx2(auVar192,auVar192);
                  auVar155 = ZEXT3264(auVar98);
                  _local_5a0 = *pauVar2;
                  local_35c = iVar80;
                  local_350 = uVar76;
                  uStack_348 = uVar77;
                  while( true ) {
                    fVar138 = local_2e0[uVar84];
                    auVar96._4_4_ = fVar138;
                    auVar96._0_4_ = fVar138;
                    auVar96._8_4_ = fVar138;
                    auVar96._12_4_ = fVar138;
                    local_1c0._16_4_ = fVar138;
                    local_1c0._0_16_ = auVar96;
                    local_1c0._20_4_ = fVar138;
                    local_1c0._24_4_ = fVar138;
                    local_1c0._28_4_ = fVar138;
                    local_1a0 = *(undefined4 *)((long)&local_2c0 + uVar84 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar84 * 4);
                    fVar111 = 1.0 - fVar138;
                    auVar160 = ZEXT416((uint)(fVar138 * fVar111 * 4.0));
                    auVar165 = vfnmsub213ss_fma(auVar96,auVar96,auVar160);
                    auVar160 = vfmadd213ss_fma(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),
                                               auVar160);
                    fVar110 = auVar160._0_4_ * 0.5;
                    fVar138 = fVar138 * fVar138 * 0.5;
                    auVar163._0_4_ = fVar138 * fVar113;
                    auVar163._4_4_ = fVar138 * fVar73;
                    auVar163._8_4_ = fVar138 * fVar74;
                    auVar163._12_4_ = fVar138 * fVar75;
                    auVar144._4_4_ = fVar110;
                    auVar144._0_4_ = fVar110;
                    auVar144._8_4_ = fVar110;
                    auVar144._12_4_ = fVar110;
                    auVar160 = vfmadd132ps_fma(auVar144,auVar163,auVar15);
                    fVar138 = auVar165._0_4_ * 0.5;
                    auVar164._4_4_ = fVar138;
                    auVar164._0_4_ = fVar138;
                    auVar164._8_4_ = fVar138;
                    auVar164._12_4_ = fVar138;
                    auVar160 = vfmadd132ps_fma(auVar164,auVar160,auVar14);
                    local_810.context = context->user;
                    fVar138 = fVar111 * -fVar111 * 0.5;
                    auVar145._4_4_ = fVar138;
                    auVar145._0_4_ = fVar138;
                    auVar145._8_4_ = fVar138;
                    auVar145._12_4_ = fVar138;
                    auVar165 = vfmadd132ps_fma(auVar145,auVar160,auVar13);
                    local_220 = auVar165._0_4_;
                    uStack_21c = local_220;
                    uStack_218 = local_220;
                    uStack_214 = local_220;
                    uStack_210 = local_220;
                    uStack_20c = local_220;
                    uStack_208 = local_220;
                    uStack_204 = local_220;
                    auVar160 = vmovshdup_avx(auVar165);
                    local_200 = auVar160._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    auVar160 = vshufps_avx(auVar165,auVar165,0xaa);
                    local_1e0 = auVar160._0_8_;
                    uStack_1d8 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_560._0_8_;
                    uStack_178 = local_560._8_8_;
                    uStack_170 = CONCAT44(uStack_54c,uStack_550);
                    uStack_168 = CONCAT44(uStack_544,uStack_548);
                    local_160 = local_540;
                    uStack_158 = uStack_538;
                    uStack_150 = CONCAT44(uStack_52c,uStack_530);
                    uStack_148 = CONCAT44(uStack_524,uStack_528);
                    local_788[1] = auVar155._0_32_;
                    *local_788 = auVar155._0_32_;
                    local_140 = (local_810.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_810.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_6a0[0] = local_280;
                    local_810.valid = (int *)local_6a0;
                    local_810.geometryUserPtr = pGVar9->userPtr;
                    local_810.hit = (RTCHitN *)&local_220;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar98 = ZEXT1632(auVar155._0_16_);
                      auVar229 = ZEXT1664(auVar229._0_16_);
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      (*pGVar9->intersectionFilterN)(&local_810);
                      auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                      auVar155 = ZEXT3264(auVar98);
                      auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar121 = vpcmpeqd_avx2(local_6a0[0],auVar137._0_32_);
                    auVar98 = auVar155._0_32_ & ~auVar121;
                    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar98 >> 0x7f,0) == '\0') &&
                          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar98 >> 0xbf,0) == '\0') &&
                        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar98[0x1f]) {
                      auVar121 = auVar155._0_32_ ^ auVar121;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar98 = ZEXT1632(auVar155._0_16_);
                        auVar229 = ZEXT1664(auVar229._0_16_);
                        auVar231 = ZEXT1664(auVar231._0_16_);
                        (*p_Var10)(&local_810);
                        auVar98 = vpcmpeqd_avx2(auVar98,auVar98);
                        auVar155 = ZEXT3264(auVar98);
                        auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar174 = vpcmpeqd_avx2(local_6a0[0],auVar137._0_32_);
                      auVar121 = auVar155._0_32_ ^ auVar174;
                      auVar98 = auVar155._0_32_ & ~auVar174;
                      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar98 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar98 >> 0x7f,0) != '\0') ||
                            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar98 >> 0xbf,0) != '\0') ||
                          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar98[0x1f] < '\0') {
                        auVar133._0_4_ = auVar155._0_4_ ^ auVar174._0_4_;
                        auVar133._4_4_ = auVar155._4_4_ ^ auVar174._4_4_;
                        auVar133._8_4_ = auVar155._8_4_ ^ auVar174._8_4_;
                        auVar133._12_4_ = auVar155._12_4_ ^ auVar174._12_4_;
                        auVar133._16_4_ = auVar155._16_4_ ^ auVar174._16_4_;
                        auVar133._20_4_ = auVar155._20_4_ ^ auVar174._20_4_;
                        auVar133._24_4_ = auVar155._24_4_ ^ auVar174._24_4_;
                        auVar133._28_4_ = auVar155._28_4_ ^ auVar174._28_4_;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])local_810.hit);
                        *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x20));
                        *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x40));
                        *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x60));
                        *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar98;
                        auVar98 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x80));
                        *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xa0));
                        *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xc0));
                        *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0xe0));
                        *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar98;
                        auVar98 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                            (local_810.hit + 0x100));
                        *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar98;
                      }
                    }
                    auVar98 = local_5e0;
                    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar121 >> 0x7f,0) == '\0') &&
                          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar121 >> 0xbf,0) == '\0') &&
                        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar121[0x1f]) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar88;
                    }
                    else {
                      uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
                    }
                    *(undefined4 *)(local_6c0 + uVar84 * 4) = 0;
                    auVar108._4_4_ = uVar88;
                    auVar108._0_4_ = uVar88;
                    auVar108._8_4_ = uVar88;
                    auVar108._12_4_ = uVar88;
                    auVar108._16_4_ = uVar88;
                    auVar108._20_4_ = uVar88;
                    auVar108._24_4_ = uVar88;
                    auVar108._28_4_ = uVar88;
                    auVar174 = vcmpps_avx(auVar98,auVar108,2);
                    auVar121 = vandps_avx(auVar174,local_6c0);
                    local_6c0 = local_6c0 & auVar174;
                    if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_6c0 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                          (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_6c0 >> 0xbf,0) == '\0') &&
                        (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_6c0[0x1f]) break;
                    auVar134._8_4_ = 0x7f800000;
                    auVar134._0_8_ = 0x7f8000007f800000;
                    auVar134._12_4_ = 0x7f800000;
                    auVar134._16_4_ = 0x7f800000;
                    auVar134._20_4_ = 0x7f800000;
                    auVar134._24_4_ = 0x7f800000;
                    auVar134._28_4_ = 0x7f800000;
                    auVar98 = vblendvps_avx(auVar134,auVar98,auVar121);
                    auVar174 = vshufps_avx(auVar98,auVar98,0xb1);
                    auVar174 = vminps_avx(auVar98,auVar174);
                    auVar106 = vshufpd_avx(auVar174,auVar174,5);
                    auVar174 = vminps_avx(auVar174,auVar106);
                    auVar106 = vpermpd_avx2(auVar174,0x4e);
                    auVar174 = vminps_avx(auVar174,auVar106);
                    auVar174 = vcmpps_avx(auVar98,auVar174,0);
                    auVar106 = auVar121 & auVar174;
                    auVar98 = auVar121;
                    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar106 >> 0x7f,0) != '\0') ||
                          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar106 >> 0xbf,0) != '\0') ||
                        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar106[0x1f] < '\0') {
                      auVar98 = vandps_avx(auVar174,auVar121);
                    }
                    uVar82 = vmovmskps_avx(auVar98);
                    uVar18 = 0;
                    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                      uVar18 = uVar18 + 1;
                    }
                    uVar84 = (ulong)uVar18;
                    local_6c0 = auVar121;
                  }
                  auVar223 = ZEXT3264(local_620);
                  auVar208 = ZEXT3264(CONCAT428(fStack_4e4,
                                                CONCAT424(fStack_4e8,
                                                          CONCAT420(fStack_4ec,
                                                                    CONCAT416(fStack_4f0,
                                                                              CONCAT412(fStack_4f4,
                                                                                        CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
                }
                auVar137 = ZEXT3264(local_780);
                fVar138 = (float)local_720;
                fVar110 = local_720._4_4_;
                fVar111 = (float)uStack_718;
                fVar112 = uStack_718._4_4_;
                fVar114 = (float)uStack_710;
                fVar115 = uStack_710._4_4_;
                fVar116 = (float)uStack_708;
                uVar224 = uStack_708._4_4_;
              }
              goto LAB_0112a6d4;
            }
          }
          auVar137 = ZEXT3264(local_780);
        }
LAB_0112a6d4:
        auVar155 = ZEXT3264(local_6e0);
      }
    }
    uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar95._4_4_ = uVar88;
    auVar95._0_4_ = uVar88;
    auVar95._8_4_ = uVar88;
    auVar95._12_4_ = uVar88;
    auVar160 = vcmpps_avx(local_3e0,auVar95,2);
    uVar81 = vmovmskps_avx(auVar160);
    uVar89 = (ulong)((uint)uVar89 & uVar81);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }